

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  ulong uVar63;
  long lVar64;
  long lVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  Geometry *geometry;
  long lVar70;
  ulong uVar71;
  byte bVar72;
  float fVar73;
  float fVar74;
  float fVar121;
  float fVar123;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar127;
  float fVar128;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar129;
  undefined4 uVar130;
  float fVar139;
  vint4 bi_2;
  undefined1 auVar131 [16];
  float fVar140;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined8 uVar141;
  vint4 bi_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  vint4 bi;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  vint4 ai_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  vint4 ai_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar177;
  float fVar180;
  vint4 ai;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  LinearSpace3fa *local_570;
  Primitive *local_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar63 = (ulong)(byte)PVar6;
  lVar26 = uVar63 * 0x25;
  fVar129 = *(float *)(prim + lVar26 + 0x12);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar79 = vsubps_avx(auVar79,*(undefined1 (*) [16])(prim + lVar26 + 6));
  auVar155._0_4_ = fVar129 * auVar79._0_4_;
  auVar155._4_4_ = fVar129 * auVar79._4_4_;
  auVar155._8_4_ = fVar129 * auVar79._8_4_;
  auVar155._12_4_ = fVar129 * auVar79._12_4_;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar131._0_4_ = fVar129 * auVar78._0_4_;
  auVar131._4_4_ = fVar129 * auVar78._4_4_;
  auVar131._8_4_ = fVar129 * auVar78._8_4_;
  auVar131._12_4_ = fVar129 * auVar78._12_4_;
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar63 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar169._4_4_ = auVar131._0_4_;
  auVar169._0_4_ = auVar131._0_4_;
  auVar169._8_4_ = auVar131._0_4_;
  auVar169._12_4_ = auVar131._0_4_;
  auVar81 = vshufps_avx(auVar131,auVar131,0x55);
  auVar82 = vshufps_avx(auVar131,auVar131,0xaa);
  fVar129 = auVar82._0_4_;
  auVar149._0_4_ = fVar129 * auVar80._0_4_;
  fVar154 = auVar82._4_4_;
  auVar149._4_4_ = fVar154 * auVar80._4_4_;
  fVar139 = auVar82._8_4_;
  auVar149._8_4_ = fVar139 * auVar80._8_4_;
  fVar140 = auVar82._12_4_;
  auVar149._12_4_ = fVar140 * auVar80._12_4_;
  auVar142._0_4_ = auVar21._0_4_ * fVar129;
  auVar142._4_4_ = auVar21._4_4_ * fVar154;
  auVar142._8_4_ = auVar21._8_4_ * fVar139;
  auVar142._12_4_ = auVar21._12_4_ * fVar140;
  auVar132._0_4_ = auVar24._0_4_ * fVar129;
  auVar132._4_4_ = auVar24._4_4_ * fVar154;
  auVar132._8_4_ = auVar24._8_4_ * fVar139;
  auVar132._12_4_ = auVar24._12_4_ * fVar140;
  auVar82 = vfmadd231ps_fma(auVar149,auVar81,auVar78);
  auVar28 = vfmadd231ps_fma(auVar142,auVar81,auVar20);
  auVar81 = vfmadd231ps_fma(auVar132,auVar23,auVar81);
  auVar83 = vfmadd231ps_fma(auVar82,auVar169,auVar79);
  auVar28 = vfmadd231ps_fma(auVar28,auVar169,auVar202);
  auVar29 = vfmadd231ps_fma(auVar81,auVar22,auVar169);
  auVar192._4_4_ = auVar155._0_4_;
  auVar192._0_4_ = auVar155._0_4_;
  auVar192._8_4_ = auVar155._0_4_;
  auVar192._12_4_ = auVar155._0_4_;
  auVar81 = vshufps_avx(auVar155,auVar155,0x55);
  auVar82 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar129 = auVar82._0_4_;
  auVar170._0_4_ = fVar129 * auVar80._0_4_;
  fVar154 = auVar82._4_4_;
  auVar170._4_4_ = fVar154 * auVar80._4_4_;
  fVar139 = auVar82._8_4_;
  auVar170._8_4_ = fVar139 * auVar80._8_4_;
  fVar140 = auVar82._12_4_;
  auVar170._12_4_ = fVar140 * auVar80._12_4_;
  auVar159._0_4_ = auVar21._0_4_ * fVar129;
  auVar159._4_4_ = auVar21._4_4_ * fVar154;
  auVar159._8_4_ = auVar21._8_4_ * fVar139;
  auVar159._12_4_ = auVar21._12_4_ * fVar140;
  auVar156._0_4_ = auVar24._0_4_ * fVar129;
  auVar156._4_4_ = auVar24._4_4_ * fVar154;
  auVar156._8_4_ = auVar24._8_4_ * fVar139;
  auVar156._12_4_ = auVar24._12_4_ * fVar140;
  auVar78 = vfmadd231ps_fma(auVar170,auVar81,auVar78);
  auVar80 = vfmadd231ps_fma(auVar159,auVar81,auVar20);
  auVar20 = vfmadd231ps_fma(auVar156,auVar81,auVar23);
  auVar30 = vfmadd231ps_fma(auVar78,auVar192,auVar79);
  auVar131 = vfmadd231ps_fma(auVar80,auVar192,auVar202);
  auVar184._8_4_ = 0x7fffffff;
  auVar184._0_8_ = 0x7fffffff7fffffff;
  auVar184._12_4_ = 0x7fffffff;
  auVar132 = vfmadd231ps_fma(auVar20,auVar192,auVar22);
  auVar79 = vandps_avx(auVar184,auVar83);
  auVar181._8_4_ = 0x219392ef;
  auVar181._0_8_ = 0x219392ef219392ef;
  auVar181._12_4_ = 0x219392ef;
  uVar71 = vcmpps_avx512vl(auVar79,auVar181,1);
  bVar12 = (bool)((byte)uVar71 & 1);
  auVar75._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._0_4_;
  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._4_4_;
  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._8_4_;
  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._12_4_;
  auVar79 = vandps_avx(auVar184,auVar28);
  uVar71 = vcmpps_avx512vl(auVar79,auVar181,1);
  bVar12 = (bool)((byte)uVar71 & 1);
  auVar76._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._0_4_;
  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._4_4_;
  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._8_4_;
  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._12_4_;
  auVar79 = vandps_avx(auVar184,auVar29);
  uVar71 = vcmpps_avx512vl(auVar79,auVar181,1);
  bVar12 = (bool)((byte)uVar71 & 1);
  auVar77._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._0_4_;
  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._4_4_;
  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._8_4_;
  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._12_4_;
  auVar78 = vrcp14ps_avx512vl(auVar75);
  auVar182._8_4_ = 0x3f800000;
  auVar182._0_8_ = 0x3f8000003f800000;
  auVar182._12_4_ = 0x3f800000;
  auVar79 = vfnmadd213ps_fma(auVar75,auVar78,auVar182);
  auVar83 = vfmadd132ps_fma(auVar79,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar76);
  auVar79 = vfnmadd213ps_fma(auVar76,auVar78,auVar182);
  auVar29 = vfmadd132ps_fma(auVar79,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar77);
  auVar79 = vfnmadd213ps_fma(auVar77,auVar78,auVar182);
  auVar27 = vfmadd132ps_fma(auVar79,auVar78,auVar78);
  fVar129 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  auVar178._4_4_ = fVar129;
  auVar178._0_4_ = fVar129;
  auVar178._8_4_ = fVar129;
  auVar178._12_4_ = fVar129;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar79 = vpmovsxwd_avx(auVar79);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar202 = vsubps_avx(auVar78,auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar78 = vpmovsxwd_avx(auVar80);
  auVar80 = vfmadd213ps_fma(auVar202,auVar178,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar78);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar78 = vpmovsxwd_avx(auVar202);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar79);
  auVar202 = vfmadd213ps_fma(auVar78,auVar178,auVar79);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar79 = vpmovsxwd_avx(auVar20);
  auVar79 = vcvtdq2ps_avx(auVar79);
  uVar71 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar63 * 2 + uVar71 + 6);
  auVar78 = vpmovsxwd_avx(auVar21);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar79);
  auVar20 = vfmadd213ps_fma(auVar78,auVar178,auVar79);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar71 + 6);
  auVar79 = vpmovsxwd_avx(auVar22);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar78 = vpmovsxwd_avx(auVar23);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar79);
  auVar21 = vfmadd213ps_fma(auVar78,auVar178,auVar79);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar79 = vpmovsxwd_avx(auVar24);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar78 = vpmovsxwd_avx(auVar81);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar79);
  auVar22 = vfmadd213ps_fma(auVar78,auVar178,auVar79);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar63) + 6);
  auVar79 = vpmovsxwd_avx(auVar82);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar78 = vpmovsxwd_avx(auVar28);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar79);
  auVar78 = vfmadd213ps_fma(auVar78,auVar178,auVar79);
  auVar79 = vsubps_avx(auVar80,auVar30);
  auVar179._0_4_ = auVar83._0_4_ * auVar79._0_4_;
  auVar179._4_4_ = auVar83._4_4_ * auVar79._4_4_;
  auVar179._8_4_ = auVar83._8_4_ * auVar79._8_4_;
  auVar179._12_4_ = auVar83._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar202,auVar30);
  auVar150._0_4_ = auVar83._0_4_ * auVar79._0_4_;
  auVar150._4_4_ = auVar83._4_4_ * auVar79._4_4_;
  auVar150._8_4_ = auVar83._8_4_ * auVar79._8_4_;
  auVar150._12_4_ = auVar83._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar20,auVar131);
  auVar171._0_4_ = auVar29._0_4_ * auVar79._0_4_;
  auVar171._4_4_ = auVar29._4_4_ * auVar79._4_4_;
  auVar171._8_4_ = auVar29._8_4_ * auVar79._8_4_;
  auVar171._12_4_ = auVar29._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar21,auVar131);
  auVar143._0_4_ = auVar29._0_4_ * auVar79._0_4_;
  auVar143._4_4_ = auVar29._4_4_ * auVar79._4_4_;
  auVar143._8_4_ = auVar29._8_4_ * auVar79._8_4_;
  auVar143._12_4_ = auVar29._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar22,auVar132);
  auVar160._0_4_ = auVar27._0_4_ * auVar79._0_4_;
  auVar160._4_4_ = auVar27._4_4_ * auVar79._4_4_;
  auVar160._8_4_ = auVar27._8_4_ * auVar79._8_4_;
  auVar160._12_4_ = auVar27._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar78,auVar132);
  auVar133._0_4_ = auVar27._0_4_ * auVar79._0_4_;
  auVar133._4_4_ = auVar27._4_4_ * auVar79._4_4_;
  auVar133._8_4_ = auVar27._8_4_ * auVar79._8_4_;
  auVar133._12_4_ = auVar27._12_4_ * auVar79._12_4_;
  auVar79 = vpminsd_avx(auVar179,auVar150);
  auVar78 = vpminsd_avx(auVar171,auVar143);
  auVar79 = vmaxps_avx(auVar79,auVar78);
  auVar78 = vpminsd_avx(auVar160,auVar133);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar83._4_4_ = uVar130;
  auVar83._0_4_ = uVar130;
  auVar83._8_4_ = uVar130;
  auVar83._12_4_ = uVar130;
  auVar78 = vmaxps_avx512vl(auVar78,auVar83);
  auVar79 = vmaxps_avx(auVar79,auVar78);
  auVar29._8_4_ = 0x3f7ffffa;
  auVar29._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar29._12_4_ = 0x3f7ffffa;
  local_3d0 = vmulps_avx512vl(auVar79,auVar29);
  auVar79 = vpmaxsd_avx(auVar179,auVar150);
  auVar78 = vpmaxsd_avx(auVar171,auVar143);
  auVar79 = vminps_avx(auVar79,auVar78);
  auVar78 = vpmaxsd_avx(auVar160,auVar133);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar27._4_4_ = uVar130;
  auVar27._0_4_ = uVar130;
  auVar27._8_4_ = uVar130;
  auVar27._12_4_ = uVar130;
  auVar78 = vminps_avx512vl(auVar78,auVar27);
  auVar79 = vminps_avx(auVar79,auVar78);
  auVar30._8_4_ = 0x3f800003;
  auVar30._0_8_ = 0x3f8000033f800003;
  auVar30._12_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar30);
  auVar78 = vpbroadcastd_avx512vl();
  uVar141 = vcmpps_avx512vl(local_3d0,auVar79,2);
  uVar71 = vpcmpgtd_avx512vl(auVar78,_DAT_01f7fcf0);
  uVar71 = ((byte)uVar141 & 0xf) & uVar71;
  if ((char)uVar71 == '\0') {
    bVar72 = 0;
  }
  else {
    local_570 = pre->ray_space + k;
    local_280 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_568 = prim;
    do {
      lVar26 = 0;
      for (uVar63 = uVar71; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar7 = *(uint *)(local_568 + 2);
      pGVar9 = (context->scene->geometries).items[uVar7].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(local_568 + lVar26 * 4 + 6));
      uVar63 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               CONCAT44(0,*(uint *)(local_568 + lVar26 * 4 + 6)) *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar129 = (pGVar9->time_range).lower;
      fVar129 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar129) / ((pGVar9->time_range).upper - fVar129)
                );
      auVar79 = vroundss_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),9);
      auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
      fVar129 = fVar129 - auVar79._0_4_;
      _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar65 = (long)(int)auVar79._0_4_ * 0x38;
      lVar26 = *(long *)(_Var10 + 0x10 + lVar65);
      lVar70 = *(long *)(_Var10 + 0x38 + lVar65);
      lVar64 = *(long *)(_Var10 + 0x48 + lVar65);
      auVar144._4_4_ = fVar129;
      auVar144._0_4_ = fVar129;
      auVar144._8_4_ = fVar129;
      auVar144._12_4_ = fVar129;
      pfVar3 = (float *)(lVar70 + uVar63 * lVar64);
      auVar185._0_4_ = fVar129 * *pfVar3;
      auVar185._4_4_ = fVar129 * pfVar3[1];
      auVar185._8_4_ = fVar129 * pfVar3[2];
      auVar185._12_4_ = fVar129 * pfVar3[3];
      pfVar3 = (float *)(lVar70 + (uVar63 + 1) * lVar64);
      auVar186._0_4_ = fVar129 * *pfVar3;
      auVar186._4_4_ = fVar129 * pfVar3[1];
      auVar186._8_4_ = fVar129 * pfVar3[2];
      auVar186._12_4_ = fVar129 * pfVar3[3];
      uVar66 = (uVar63 + 2) * lVar64;
      auVar79 = vmulps_avx512vl(auVar144,*(undefined1 (*) [16])(lVar70 + uVar66));
      auVar78 = vmulps_avx512vl(auVar144,*(undefined1 (*) [16])(lVar70 + lVar64 * (uVar63 + 3)));
      lVar70 = *(long *)(_Var10 + lVar65);
      fVar129 = 1.0 - fVar129;
      auVar134._4_4_ = fVar129;
      auVar134._0_4_ = fVar129;
      auVar134._8_4_ = fVar129;
      auVar134._12_4_ = fVar129;
      local_630 = vfmadd231ps_fma(auVar185,auVar134,*(undefined1 (*) [16])(lVar70 + lVar26 * uVar63)
                                 );
      local_640 = vfmadd231ps_fma(auVar186,auVar134,
                                  *(undefined1 (*) [16])(lVar70 + lVar26 * (uVar63 + 1)));
      local_650 = vfmadd231ps_avx512vl
                            (auVar79,auVar134,*(undefined1 (*) [16])(lVar70 + lVar26 * (uVar63 + 2))
                            );
      _local_4b0 = vfmadd231ps_avx512vl
                             (auVar78,auVar134,
                              *(undefined1 (*) [16])(lVar70 + lVar26 * (uVar63 + 3)));
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar26 = (long)iVar8 * 0x44;
      auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar80 = vsubps_avx(local_630,auVar79);
      uVar130 = auVar80._0_4_;
      auVar151._4_4_ = uVar130;
      auVar151._0_4_ = uVar130;
      auVar151._8_4_ = uVar130;
      auVar151._12_4_ = uVar130;
      auVar78 = vshufps_avx(auVar80,auVar80,0x55);
      aVar4 = (local_570->vx).field_0;
      aVar5 = (local_570->vy).field_0;
      fVar129 = (local_570->vz).field_0.m128[0];
      fVar154 = *(float *)((long)&(local_570->vz).field_0 + 4);
      fVar139 = *(float *)((long)&(local_570->vz).field_0 + 8);
      fVar140 = *(float *)((long)&(local_570->vz).field_0 + 0xc);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar188._0_4_ = fVar129 * auVar80._0_4_;
      auVar188._4_4_ = fVar154 * auVar80._4_4_;
      auVar188._8_4_ = fVar139 * auVar80._8_4_;
      auVar188._12_4_ = fVar140 * auVar80._12_4_;
      auVar78 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar5,auVar78);
      auVar202 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar151);
      auVar80 = vsubps_avx(local_640,auVar79);
      uVar130 = auVar80._0_4_;
      auVar152._4_4_ = uVar130;
      auVar152._0_4_ = uVar130;
      auVar152._8_4_ = uVar130;
      auVar152._12_4_ = uVar130;
      auVar78 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar189._0_4_ = fVar129 * auVar80._0_4_;
      auVar189._4_4_ = fVar154 * auVar80._4_4_;
      auVar189._8_4_ = fVar139 * auVar80._8_4_;
      auVar189._12_4_ = fVar140 * auVar80._12_4_;
      auVar78 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar5,auVar78);
      auVar20 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar152);
      auVar80 = vsubps_avx512vl(local_650,auVar79);
      uVar130 = auVar80._0_4_;
      auVar153._4_4_ = uVar130;
      auVar153._0_4_ = uVar130;
      auVar153._8_4_ = uVar130;
      auVar153._12_4_ = uVar130;
      auVar78 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar190._0_4_ = fVar129 * auVar80._0_4_;
      auVar190._4_4_ = fVar154 * auVar80._4_4_;
      auVar190._8_4_ = fVar139 * auVar80._8_4_;
      auVar190._12_4_ = fVar140 * auVar80._12_4_;
      auVar78 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar5,auVar78);
      auVar80 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar153);
      auVar78 = vsubps_avx512vl(_local_4b0,auVar79);
      uVar130 = auVar78._0_4_;
      auVar145._4_4_ = uVar130;
      auVar145._0_4_ = uVar130;
      auVar145._8_4_ = uVar130;
      auVar145._12_4_ = uVar130;
      auVar79 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar194._0_4_ = fVar129 * auVar78._0_4_;
      auVar194._4_4_ = fVar154 * auVar78._4_4_;
      auVar194._8_4_ = fVar139 * auVar78._8_4_;
      auVar194._12_4_ = fVar140 * auVar78._12_4_;
      auVar79 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar5,auVar79);
      auVar21 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar145);
      auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar26);
      uVar130 = auVar202._0_4_;
      local_500._4_4_ = uVar130;
      local_500._0_4_ = uVar130;
      local_500._8_4_ = uVar130;
      local_500._12_4_ = uVar130;
      local_500._16_4_ = uVar130;
      local_500._20_4_ = uVar130;
      local_500._24_4_ = uVar130;
      local_500._28_4_ = uVar130;
      auVar101 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x484);
      auVar84._8_4_ = 1;
      auVar84._0_8_ = 0x100000001;
      auVar84._12_4_ = 1;
      auVar84._16_4_ = 1;
      auVar84._20_4_ = 1;
      auVar84._24_4_ = 1;
      auVar84._28_4_ = 1;
      local_520 = vpermps_avx2(auVar84,ZEXT1632(auVar202));
      uVar130 = auVar20._0_4_;
      local_680._4_4_ = uVar130;
      local_680._0_4_ = uVar130;
      local_680._8_4_ = uVar130;
      local_680._12_4_ = uVar130;
      local_680._16_4_ = uVar130;
      local_680._20_4_ = uVar130;
      local_680._24_4_ = uVar130;
      local_680._28_4_ = uVar130;
      local_6a0 = vpermps_avx512vl(auVar84,ZEXT1632(auVar20));
      auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x908);
      local_5c0 = vbroadcastss_avx512vl(auVar80);
      auVar209 = ZEXT3264(local_5c0);
      local_5e0 = vpermps_avx512vl(auVar84,ZEXT1632(auVar80));
      auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar21);
      auVar207 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar84,ZEXT1632(auVar21));
      auVar208 = ZEXT3264(local_620);
      auVar84 = vmulps_avx512vl(local_600,auVar96);
      auVar85 = vmulps_avx512vl(local_620,auVar96);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar97,local_5c0);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar97,local_5e0);
      auVar79 = vfmadd231ps_fma(auVar84,auVar101,local_680);
      auVar86 = vfmadd231ps_avx512vl(auVar85,auVar101,local_6a0);
      auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar99,local_500);
      auVar84 = *(undefined1 (*) [32])(bspline_basis1 + lVar26);
      auVar85 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x484);
      auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x908);
      auVar88 = vfmadd231ps_avx512vl(auVar86,auVar99,local_520);
      auVar86 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0xd8c);
      auVar89 = vmulps_avx512vl(local_600,auVar86);
      auVar90 = vmulps_avx512vl(local_620,auVar86);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar95,local_5c0);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar95,local_5e0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar85,local_680);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar85,local_6a0);
      auVar22 = vfmadd231ps_fma(auVar89,auVar84,local_500);
      auVar23 = vfmadd231ps_fma(auVar90,auVar84,local_520);
      auVar90 = vsubps_avx512vl(ZEXT1632(auVar22),auVar87);
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar23),auVar88);
      auVar89 = vmulps_avx512vl(auVar88,auVar90);
      auVar92 = vmulps_avx512vl(auVar87,auVar91);
      auVar89 = vsubps_avx512vl(auVar89,auVar92);
      auVar79 = vshufps_avx(local_630,local_630,0xff);
      uVar141 = auVar79._0_8_;
      local_80._8_8_ = uVar141;
      local_80._0_8_ = uVar141;
      local_80._16_8_ = uVar141;
      local_80._24_8_ = uVar141;
      auVar79 = vshufps_avx(local_640,local_640,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar79);
      auVar79 = vshufps_avx512vl(local_650,local_650,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar79);
      auVar79 = vshufps_avx512vl(_local_4b0,_local_4b0,0xff);
      uVar141 = auVar79._0_8_;
      register0x000012c8 = uVar141;
      local_e0 = uVar141;
      register0x000012d0 = uVar141;
      register0x000012d8 = uVar141;
      auVar92 = vmulps_avx512vl(_local_e0,auVar96);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,local_c0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar101,local_a0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_80);
      auVar93 = vmulps_avx512vl(_local_e0,auVar86);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,local_c0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar85,local_a0);
      auVar24 = vfmadd231ps_fma(auVar93,auVar84,local_80);
      auVar93 = vmulps_avx512vl(auVar91,auVar91);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar90);
      auVar94 = vmaxps_avx512vl(auVar92,ZEXT1632(auVar24));
      auVar94 = vmulps_avx512vl(auVar94,auVar94);
      auVar93 = vmulps_avx512vl(auVar94,auVar93);
      auVar89 = vmulps_avx512vl(auVar89,auVar89);
      uVar141 = vcmpps_avx512vl(auVar89,auVar93,2);
      auVar79 = vblendps_avx(auVar202,local_630,8);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar78 = vandps_avx512vl(auVar79,auVar81);
      auVar79 = vblendps_avx(auVar20,local_640,8);
      auVar79 = vandps_avx512vl(auVar79,auVar81);
      auVar78 = vmaxps_avx(auVar78,auVar79);
      auVar79 = vblendps_avx(auVar80,local_650,8);
      auVar82 = vandps_avx512vl(auVar79,auVar81);
      auVar79 = vblendps_avx(auVar21,_local_4b0,8);
      auVar79 = vandps_avx512vl(auVar79,auVar81);
      auVar79 = vmaxps_avx(auVar82,auVar79);
      auVar79 = vmaxps_avx(auVar78,auVar79);
      auVar78 = vmovshdup_avx(auVar79);
      auVar78 = vmaxss_avx(auVar78,auVar79);
      auVar79 = vshufpd_avx(auVar79,auVar79,1);
      auVar79 = vmaxss_avx(auVar79,auVar78);
      auVar78 = vcvtsi2ss_avx512f(local_650,iVar8);
      local_460._0_16_ = auVar78;
      auVar93._0_4_ = auVar78._0_4_;
      auVar93._4_4_ = auVar93._0_4_;
      auVar93._8_4_ = auVar93._0_4_;
      auVar93._12_4_ = auVar93._0_4_;
      auVar93._16_4_ = auVar93._0_4_;
      auVar93._20_4_ = auVar93._0_4_;
      auVar93._24_4_ = auVar93._0_4_;
      auVar93._28_4_ = auVar93._0_4_;
      uVar25 = vcmpps_avx512vl(auVar93,_DAT_01faff40,0xe);
      bVar72 = (byte)uVar141 & (byte)uVar25;
      fVar129 = auVar79._0_4_ * 4.7683716e-07;
      auVar89._8_4_ = 2;
      auVar89._0_8_ = 0x200000002;
      auVar89._12_4_ = 2;
      auVar89._16_4_ = 2;
      auVar89._20_4_ = 2;
      auVar89._24_4_ = 2;
      auVar89._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar89,ZEXT1632(auVar202));
      local_120 = vpermps_avx512vl(auVar89,ZEXT1632(auVar20));
      local_140 = vpermps_avx512vl(auVar89,ZEXT1632(auVar80));
      auVar89 = vpermps_avx2(auVar89,ZEXT1632(auVar21));
      uVar69 = *(uint *)(ray + k * 4 + 0x60);
      auVar79 = local_100._0_16_;
      if (bVar72 == 0) {
        uVar66 = 0;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar201 = ZEXT3264(auVar99);
        auVar79 = vxorps_avx512vl(auVar79,auVar79);
        auVar203 = ZEXT1664(auVar79);
        auVar204 = ZEXT3264(local_500);
        auVar205 = ZEXT3264(local_520);
        auVar200 = ZEXT3264(local_680);
        auVar199 = ZEXT3264(local_6a0);
        auVar206 = ZEXT3264(local_5e0);
      }
      else {
        local_560._0_16_ = ZEXT416(uVar69);
        auVar86 = vmulps_avx512vl(auVar89,auVar86);
        auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar86);
        auVar85 = vfmadd213ps_avx512vl(auVar85,local_120,auVar95);
        auVar94 = vfmadd213ps_avx512vl(auVar84,local_100,auVar85);
        auVar96 = vmulps_avx512vl(auVar89,auVar96);
        auVar97 = vfmadd213ps_avx512vl(auVar97,local_140,auVar96);
        auVar85 = vfmadd213ps_avx512vl(auVar101,local_120,auVar97);
        auVar101 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1210);
        auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1694);
        auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1b18);
        auVar84 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1f9c);
        auVar98 = vfmadd213ps_avx512vl(auVar99,local_100,auVar85);
        auVar99 = vmulps_avx512vl(local_600,auVar84);
        auVar85 = vmulps_avx512vl(local_620,auVar84);
        auVar191._0_4_ = auVar89._0_4_ * auVar84._0_4_;
        auVar191._4_4_ = auVar89._4_4_ * auVar84._4_4_;
        auVar191._8_4_ = auVar89._8_4_ * auVar84._8_4_;
        auVar191._12_4_ = auVar89._12_4_ * auVar84._12_4_;
        auVar191._16_4_ = auVar89._16_4_ * auVar84._16_4_;
        auVar191._20_4_ = auVar89._20_4_ * auVar84._20_4_;
        auVar191._24_4_ = auVar89._24_4_ * auVar84._24_4_;
        auVar191._28_4_ = 0;
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_5c0);
        auVar84 = vfmadd231ps_avx512vl(auVar85,auVar96,local_5e0);
        auVar96 = vfmadd231ps_avx512vl(auVar191,local_140,auVar96);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_680);
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar97,local_6a0);
        auVar85 = vfmadd231ps_avx512vl(auVar96,local_120,auVar97);
        auVar95 = vfmadd231ps_avx512vl(auVar99,auVar101,local_500);
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar101,local_520);
        auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1210);
        auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1b18);
        auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1f9c);
        auVar85 = vfmadd231ps_avx512vl(auVar85,local_100,auVar101);
        auVar86 = vmulps_avx512vl(local_600,auVar96);
        auVar100 = vmulps_avx512vl(local_620,auVar96);
        auVar101._4_4_ = auVar89._4_4_ * auVar96._4_4_;
        auVar101._0_4_ = auVar89._0_4_ * auVar96._0_4_;
        auVar101._8_4_ = auVar89._8_4_ * auVar96._8_4_;
        auVar101._12_4_ = auVar89._12_4_ * auVar96._12_4_;
        auVar101._16_4_ = auVar89._16_4_ * auVar96._16_4_;
        auVar101._20_4_ = auVar89._20_4_ * auVar96._20_4_;
        auVar101._24_4_ = auVar89._24_4_ * auVar96._24_4_;
        auVar101._28_4_ = auVar96._28_4_;
        auVar96 = vfmadd231ps_avx512vl(auVar86,auVar97,local_5c0);
        auVar86 = vfmadd231ps_avx512vl(auVar100,auVar97,local_5e0);
        auVar97 = vfmadd231ps_avx512vl(auVar101,local_140,auVar97);
        auVar101 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1694);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,local_680);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar101,local_6a0);
        auVar101 = vfmadd231ps_avx512vl(auVar97,local_120,auVar101);
        auVar97 = vfmadd231ps_avx512vl(auVar96,auVar99,local_500);
        auVar96 = vfmadd231ps_avx512vl(auVar86,auVar99,local_520);
        auVar86 = vfmadd231ps_avx512vl(auVar101,local_100,auVar99);
        auVar195._8_4_ = 0x7fffffff;
        auVar195._0_8_ = 0x7fffffff7fffffff;
        auVar195._12_4_ = 0x7fffffff;
        auVar195._16_4_ = 0x7fffffff;
        auVar195._20_4_ = 0x7fffffff;
        auVar195._24_4_ = 0x7fffffff;
        auVar195._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(auVar95,auVar195);
        auVar101 = vandps_avx(auVar84,auVar195);
        auVar101 = vmaxps_avx(auVar99,auVar101);
        auVar99 = vandps_avx(auVar85,auVar195);
        auVar99 = vmaxps_avx(auVar101,auVar99);
        auVar85 = vbroadcastss_avx512vl(ZEXT416((uint)fVar129));
        uVar63 = vcmpps_avx512vl(auVar99,auVar85,1);
        bVar12 = (bool)((byte)uVar63 & 1);
        auVar100._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar95._0_4_);
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar95._4_4_);
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar95._8_4_);
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar95._12_4_);
        bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar95._16_4_);
        bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar95._20_4_);
        bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar95._24_4_);
        bVar12 = SUB81(uVar63 >> 7,0);
        auVar100._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar95._28_4_;
        bVar12 = (bool)((byte)uVar63 & 1);
        auVar102._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar84._0_4_);
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar84._4_4_);
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar84._8_4_);
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar84._12_4_);
        bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar12 * auVar91._16_4_ | (uint)!bVar12 * auVar84._16_4_);
        bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar12 * auVar91._20_4_ | (uint)!bVar12 * auVar84._20_4_);
        bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar12 * auVar91._24_4_ | (uint)!bVar12 * auVar84._24_4_);
        bVar12 = SUB81(uVar63 >> 7,0);
        auVar102._28_4_ = (uint)bVar12 * auVar91._28_4_ | (uint)!bVar12 * auVar84._28_4_;
        auVar99 = vandps_avx(auVar195,auVar97);
        auVar101 = vandps_avx(auVar96,auVar195);
        auVar101 = vmaxps_avx(auVar99,auVar101);
        auVar99 = vandps_avx(auVar86,auVar195);
        auVar99 = vmaxps_avx(auVar101,auVar99);
        uVar63 = vcmpps_avx512vl(auVar99,auVar85,1);
        bVar12 = (bool)((byte)uVar63 & 1);
        auVar103._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar97._0_4_);
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar97._4_4_);
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar97._8_4_);
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar97._12_4_);
        bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar97._16_4_);
        bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar97._20_4_);
        bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar97._24_4_);
        bVar12 = SUB81(uVar63 >> 7,0);
        auVar103._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar97._28_4_;
        bVar12 = (bool)((byte)uVar63 & 1);
        auVar104._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar96._0_4_);
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar96._4_4_);
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar96._8_4_);
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar96._12_4_);
        bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar12 * auVar91._16_4_ | (uint)!bVar12 * auVar96._16_4_);
        bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar12 * auVar91._20_4_ | (uint)!bVar12 * auVar96._20_4_);
        bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar12 * auVar91._24_4_ | (uint)!bVar12 * auVar96._24_4_);
        bVar12 = SUB81(uVar63 >> 7,0);
        auVar104._28_4_ = (uint)bVar12 * auVar91._28_4_ | (uint)!bVar12 * auVar96._28_4_;
        auVar83 = vxorps_avx512vl(auVar79,auVar79);
        auVar203 = ZEXT1664(auVar83);
        auVar99 = vfmadd213ps_avx512vl(auVar100,auVar100,ZEXT1632(auVar83));
        auVar79 = vfmadd231ps_fma(auVar99,auVar102,auVar102);
        auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
        fVar154 = auVar101._0_4_;
        fVar139 = auVar101._4_4_;
        fVar140 = auVar101._8_4_;
        fVar177 = auVar101._12_4_;
        fVar176 = auVar101._16_4_;
        fVar180 = auVar101._20_4_;
        fVar73 = auVar101._24_4_;
        auVar99._4_4_ = fVar139 * fVar139 * fVar139 * auVar79._4_4_ * -0.5;
        auVar99._0_4_ = fVar154 * fVar154 * fVar154 * auVar79._0_4_ * -0.5;
        auVar99._8_4_ = fVar140 * fVar140 * fVar140 * auVar79._8_4_ * -0.5;
        auVar99._12_4_ = fVar177 * fVar177 * fVar177 * auVar79._12_4_ * -0.5;
        auVar99._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar99._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
        auVar99._24_4_ = fVar73 * fVar73 * fVar73 * -0.0;
        auVar99._28_4_ = auVar86._28_4_;
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar84,auVar101);
        auVar97._4_4_ = auVar102._4_4_ * auVar99._4_4_;
        auVar97._0_4_ = auVar102._0_4_ * auVar99._0_4_;
        auVar97._8_4_ = auVar102._8_4_ * auVar99._8_4_;
        auVar97._12_4_ = auVar102._12_4_ * auVar99._12_4_;
        auVar97._16_4_ = auVar102._16_4_ * auVar99._16_4_;
        auVar97._20_4_ = auVar102._20_4_ * auVar99._20_4_;
        auVar97._24_4_ = auVar102._24_4_ * auVar99._24_4_;
        auVar97._28_4_ = 0;
        auVar96._4_4_ = auVar99._4_4_ * -auVar100._4_4_;
        auVar96._0_4_ = auVar99._0_4_ * -auVar100._0_4_;
        auVar96._8_4_ = auVar99._8_4_ * -auVar100._8_4_;
        auVar96._12_4_ = auVar99._12_4_ * -auVar100._12_4_;
        auVar96._16_4_ = auVar99._16_4_ * -auVar100._16_4_;
        auVar96._20_4_ = auVar99._20_4_ * -auVar100._20_4_;
        auVar96._24_4_ = auVar99._24_4_ * -auVar100._24_4_;
        auVar96._28_4_ = auVar102._28_4_;
        auVar99 = vmulps_avx512vl(auVar99,ZEXT1632(auVar83));
        auVar90 = ZEXT1632(auVar83);
        auVar101 = vfmadd213ps_avx512vl(auVar103,auVar103,auVar90);
        auVar79 = vfmadd231ps_fma(auVar101,auVar104,auVar104);
        auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
        fVar154 = auVar101._0_4_;
        fVar139 = auVar101._4_4_;
        fVar140 = auVar101._8_4_;
        fVar177 = auVar101._12_4_;
        fVar176 = auVar101._16_4_;
        fVar180 = auVar101._20_4_;
        fVar73 = auVar101._24_4_;
        auVar85._4_4_ = fVar139 * fVar139 * fVar139 * auVar79._4_4_ * -0.5;
        auVar85._0_4_ = fVar154 * fVar154 * fVar154 * auVar79._0_4_ * -0.5;
        auVar85._8_4_ = fVar140 * fVar140 * fVar140 * auVar79._8_4_ * -0.5;
        auVar85._12_4_ = fVar177 * fVar177 * fVar177 * auVar79._12_4_ * -0.5;
        auVar85._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar85._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
        auVar85._24_4_ = fVar73 * fVar73 * fVar73 * -0.0;
        auVar85._28_4_ = 0;
        auVar84 = vfmadd231ps_avx512vl(auVar85,auVar84,auVar101);
        auVar95._4_4_ = auVar104._4_4_ * auVar84._4_4_;
        auVar95._0_4_ = auVar104._0_4_ * auVar84._0_4_;
        auVar95._8_4_ = auVar104._8_4_ * auVar84._8_4_;
        auVar95._12_4_ = auVar104._12_4_ * auVar84._12_4_;
        auVar95._16_4_ = auVar104._16_4_ * auVar84._16_4_;
        auVar95._20_4_ = auVar104._20_4_ * auVar84._20_4_;
        auVar95._24_4_ = auVar104._24_4_ * auVar84._24_4_;
        auVar95._28_4_ = auVar101._28_4_;
        auVar86._4_4_ = -auVar103._4_4_ * auVar84._4_4_;
        auVar86._0_4_ = -auVar103._0_4_ * auVar84._0_4_;
        auVar86._8_4_ = -auVar103._8_4_ * auVar84._8_4_;
        auVar86._12_4_ = -auVar103._12_4_ * auVar84._12_4_;
        auVar86._16_4_ = -auVar103._16_4_ * auVar84._16_4_;
        auVar86._20_4_ = -auVar103._20_4_ * auVar84._20_4_;
        auVar86._24_4_ = -auVar103._24_4_ * auVar84._24_4_;
        auVar86._28_4_ = auVar103._28_4_ ^ 0x80000000;
        auVar101 = vmulps_avx512vl(auVar84,auVar90);
        auVar79 = vfmadd213ps_fma(auVar97,auVar92,auVar87);
        auVar78 = vfmadd213ps_fma(auVar96,auVar92,auVar88);
        auVar84 = vfmadd213ps_avx512vl(auVar99,auVar92,auVar98);
        auVar85 = vfmadd213ps_avx512vl(auVar95,ZEXT1632(auVar24),ZEXT1632(auVar22));
        auVar81 = vfnmadd213ps_fma(auVar97,auVar92,auVar87);
        auVar87 = ZEXT1632(auVar24);
        auVar80 = vfmadd213ps_fma(auVar86,auVar87,ZEXT1632(auVar23));
        auVar82 = vfnmadd213ps_fma(auVar96,auVar92,auVar88);
        auVar202 = vfmadd213ps_fma(auVar101,auVar87,auVar94);
        auVar97 = vfnmadd231ps_avx512vl(auVar98,auVar92,auVar99);
        auVar22 = vfnmadd213ps_fma(auVar95,auVar87,ZEXT1632(auVar22));
        auVar23 = vfnmadd213ps_fma(auVar86,auVar87,ZEXT1632(auVar23));
        auVar28 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar24),auVar101);
        auVar101 = vsubps_avx512vl(auVar85,ZEXT1632(auVar81));
        auVar99 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar82));
        auVar96 = vsubps_avx512vl(ZEXT1632(auVar202),auVar97);
        auVar95 = vmulps_avx512vl(auVar99,auVar97);
        auVar20 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar82),auVar96);
        auVar87._4_4_ = auVar81._4_4_ * auVar96._4_4_;
        auVar87._0_4_ = auVar81._0_4_ * auVar96._0_4_;
        auVar87._8_4_ = auVar81._8_4_ * auVar96._8_4_;
        auVar87._12_4_ = auVar81._12_4_ * auVar96._12_4_;
        auVar87._16_4_ = auVar96._16_4_ * 0.0;
        auVar87._20_4_ = auVar96._20_4_ * 0.0;
        auVar87._24_4_ = auVar96._24_4_ * 0.0;
        auVar87._28_4_ = auVar96._28_4_;
        auVar96 = vfmsub231ps_avx512vl(auVar87,auVar97,auVar101);
        auVar88._4_4_ = auVar82._4_4_ * auVar101._4_4_;
        auVar88._0_4_ = auVar82._0_4_ * auVar101._0_4_;
        auVar88._8_4_ = auVar82._8_4_ * auVar101._8_4_;
        auVar88._12_4_ = auVar82._12_4_ * auVar101._12_4_;
        auVar88._16_4_ = auVar101._16_4_ * 0.0;
        auVar88._20_4_ = auVar101._20_4_ * 0.0;
        auVar88._24_4_ = auVar101._24_4_ * 0.0;
        auVar88._28_4_ = auVar101._28_4_;
        auVar21 = vfmsub231ps_fma(auVar88,ZEXT1632(auVar81),auVar99);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar90,auVar96);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,ZEXT1632(auVar20));
        auVar100 = ZEXT1632(auVar83);
        uVar63 = vcmpps_avx512vl(auVar99,auVar100,2);
        bVar62 = (byte)uVar63;
        fVar73 = (float)((uint)(bVar62 & 1) * auVar79._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar22._0_4_);
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        fVar121 = (float)((uint)bVar12 * auVar79._4_4_ | (uint)!bVar12 * auVar22._4_4_);
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        fVar123 = (float)((uint)bVar12 * auVar79._8_4_ | (uint)!bVar12 * auVar22._8_4_);
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        fVar125 = (float)((uint)bVar12 * auVar79._12_4_ | (uint)!bVar12 * auVar22._12_4_);
        auVar95 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar73))));
        fVar74 = (float)((uint)(bVar62 & 1) * auVar78._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar23._0_4_);
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        fVar122 = (float)((uint)bVar12 * auVar78._4_4_ | (uint)!bVar12 * auVar23._4_4_);
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        fVar124 = (float)((uint)bVar12 * auVar78._8_4_ | (uint)!bVar12 * auVar23._8_4_);
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        fVar126 = (float)((uint)bVar12 * auVar78._12_4_ | (uint)!bVar12 * auVar23._12_4_);
        auVar86 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar124,CONCAT44(fVar122,fVar74))));
        auVar98._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar28._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar28._4_4_);
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar28._8_4_);
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar28._12_4_);
        fVar154 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar84._16_4_);
        auVar98._16_4_ = fVar154;
        fVar139 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar84._20_4_);
        auVar98._20_4_ = fVar139;
        fVar140 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar84._24_4_);
        auVar98._24_4_ = fVar140;
        iVar1 = (uint)(byte)(uVar63 >> 7) * auVar84._28_4_;
        auVar98._28_4_ = iVar1;
        auVar101 = vblendmps_avx512vl(ZEXT1632(auVar81),auVar85);
        auVar105._0_4_ =
             (uint)(bVar62 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar20._0_4_;
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar105._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar20._4_4_;
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar105._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar20._8_4_;
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar105._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar20._12_4_;
        auVar105._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_;
        auVar105._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_;
        auVar105._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_;
        auVar105._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
        auVar101 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar80));
        auVar106._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar78._0_4_
                    );
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar78._4_4_);
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar78._8_4_);
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar78._12_4_);
        fVar177 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_);
        auVar106._16_4_ = fVar177;
        fVar176 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_);
        auVar106._20_4_ = fVar176;
        fVar180 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_);
        auVar106._24_4_ = fVar180;
        auVar106._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
        auVar101 = vblendmps_avx512vl(auVar97,ZEXT1632(auVar202));
        auVar107._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar84._0_4_
                    );
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar84._4_4_);
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar84._8_4_);
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar84._12_4_);
        bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar84._16_4_);
        bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar84._20_4_);
        bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar84._24_4_);
        bVar12 = SUB81(uVar63 >> 7,0);
        auVar107._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar84._28_4_;
        auVar108._0_4_ =
             (uint)(bVar62 & 1) * (int)auVar81._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar85._0_4_;
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar12 * (int)auVar81._4_4_ | (uint)!bVar12 * auVar85._4_4_;
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar12 * (int)auVar81._8_4_ | (uint)!bVar12 * auVar85._8_4_;
        bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar12 * (int)auVar81._12_4_ | (uint)!bVar12 * auVar85._12_4_;
        auVar108._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar85._16_4_;
        auVar108._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar85._20_4_;
        auVar108._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar85._24_4_;
        auVar108._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar85._28_4_;
        bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar63 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar109._0_4_ =
             (uint)(bVar62 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar202._0_4_;
        bVar13 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar202._4_4_;
        bVar13 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar202._8_4_;
        bVar13 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar202._12_4_;
        auVar109._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar97._16_4_;
        auVar109._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar97._20_4_;
        auVar109._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar97._24_4_;
        iVar2 = (uint)(byte)(uVar63 >> 7) * auVar97._28_4_;
        auVar109._28_4_ = iVar2;
        auVar87 = vsubps_avx512vl(auVar108,auVar95);
        auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar82._12_4_ |
                                                 (uint)!bVar15 * auVar80._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar82._8_4_ |
                                                          (uint)!bVar14 * auVar80._8_4_,
                                                          CONCAT44((uint)bVar12 * (int)auVar82._4_4_
                                                                   | (uint)!bVar12 * auVar80._4_4_,
                                                                   (uint)(bVar62 & 1) *
                                                                   (int)auVar82._0_4_ |
                                                                   (uint)!(bool)(bVar62 & 1) *
                                                                   auVar80._0_4_)))),auVar86);
        auVar97 = vsubps_avx(auVar109,auVar98);
        auVar96 = vsubps_avx(auVar95,auVar105);
        auVar84 = vsubps_avx(auVar86,auVar106);
        auVar85 = vsubps_avx(auVar98,auVar107);
        auVar90._4_4_ = auVar97._4_4_ * fVar121;
        auVar90._0_4_ = auVar97._0_4_ * fVar73;
        auVar90._8_4_ = auVar97._8_4_ * fVar123;
        auVar90._12_4_ = auVar97._12_4_ * fVar125;
        auVar90._16_4_ = auVar97._16_4_ * 0.0;
        auVar90._20_4_ = auVar97._20_4_ * 0.0;
        auVar90._24_4_ = auVar97._24_4_ * 0.0;
        auVar90._28_4_ = iVar2;
        auVar79 = vfmsub231ps_fma(auVar90,auVar98,auVar87);
        auVar91._4_4_ = fVar122 * auVar87._4_4_;
        auVar91._0_4_ = fVar74 * auVar87._0_4_;
        auVar91._8_4_ = fVar124 * auVar87._8_4_;
        auVar91._12_4_ = fVar126 * auVar87._12_4_;
        auVar91._16_4_ = auVar87._16_4_ * 0.0;
        auVar91._20_4_ = auVar87._20_4_ * 0.0;
        auVar91._24_4_ = auVar87._24_4_ * 0.0;
        auVar91._28_4_ = auVar99._28_4_;
        auVar78 = vfmsub231ps_fma(auVar91,auVar95,auVar101);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar100,ZEXT1632(auVar79));
        auVar163._0_4_ = auVar101._0_4_ * auVar98._0_4_;
        auVar163._4_4_ = auVar101._4_4_ * auVar98._4_4_;
        auVar163._8_4_ = auVar101._8_4_ * auVar98._8_4_;
        auVar163._12_4_ = auVar101._12_4_ * auVar98._12_4_;
        auVar163._16_4_ = auVar101._16_4_ * fVar154;
        auVar163._20_4_ = auVar101._20_4_ * fVar139;
        auVar163._24_4_ = auVar101._24_4_ * fVar140;
        auVar163._28_4_ = 0;
        auVar79 = vfmsub231ps_fma(auVar163,auVar86,auVar97);
        auVar88 = vfmadd231ps_avx512vl(auVar99,auVar100,ZEXT1632(auVar79));
        auVar99 = vmulps_avx512vl(auVar85,auVar105);
        auVar99 = vfmsub231ps_avx512vl(auVar99,auVar96,auVar107);
        auVar94._4_4_ = auVar84._4_4_ * auVar107._4_4_;
        auVar94._0_4_ = auVar84._0_4_ * auVar107._0_4_;
        auVar94._8_4_ = auVar84._8_4_ * auVar107._8_4_;
        auVar94._12_4_ = auVar84._12_4_ * auVar107._12_4_;
        auVar94._16_4_ = auVar84._16_4_ * auVar107._16_4_;
        auVar94._20_4_ = auVar84._20_4_ * auVar107._20_4_;
        auVar94._24_4_ = auVar84._24_4_ * auVar107._24_4_;
        auVar94._28_4_ = auVar107._28_4_;
        auVar79 = vfmsub231ps_fma(auVar94,auVar106,auVar85);
        auVar164._0_4_ = auVar106._0_4_ * auVar96._0_4_;
        auVar164._4_4_ = auVar106._4_4_ * auVar96._4_4_;
        auVar164._8_4_ = auVar106._8_4_ * auVar96._8_4_;
        auVar164._12_4_ = auVar106._12_4_ * auVar96._12_4_;
        auVar164._16_4_ = fVar177 * auVar96._16_4_;
        auVar164._20_4_ = fVar176 * auVar96._20_4_;
        auVar164._24_4_ = fVar180 * auVar96._24_4_;
        auVar164._28_4_ = 0;
        auVar78 = vfmsub231ps_fma(auVar164,auVar84,auVar105);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar100,auVar99);
        auVar90 = vfmadd231ps_avx512vl(auVar99,auVar100,ZEXT1632(auVar79));
        auVar99 = vmaxps_avx(auVar88,auVar90);
        uVar141 = vcmpps_avx512vl(auVar99,auVar100,2);
        bVar72 = bVar72 & (byte)uVar141;
        auVar204 = ZEXT3264(local_500);
        auVar205 = ZEXT3264(local_520);
        auVar200 = ZEXT3264(local_680);
        auVar199 = ZEXT3264(local_6a0);
        if (bVar72 == 0) {
          uVar66 = 0;
          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar201 = ZEXT3264(auVar99);
          auVar209 = ZEXT3264(local_5c0);
          auVar206 = ZEXT3264(local_5e0);
          auVar207 = ZEXT3264(local_600);
          auVar208 = ZEXT3264(local_620);
        }
        else {
          auVar91 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
          auVar198 = ZEXT3264(auVar91);
          auVar37._4_4_ = auVar85._4_4_ * auVar101._4_4_;
          auVar37._0_4_ = auVar85._0_4_ * auVar101._0_4_;
          auVar37._8_4_ = auVar85._8_4_ * auVar101._8_4_;
          auVar37._12_4_ = auVar85._12_4_ * auVar101._12_4_;
          auVar37._16_4_ = auVar85._16_4_ * auVar101._16_4_;
          auVar37._20_4_ = auVar85._20_4_ * auVar101._20_4_;
          auVar37._24_4_ = auVar85._24_4_ * auVar101._24_4_;
          auVar37._28_4_ = auVar99._28_4_;
          auVar80 = vfmsub231ps_fma(auVar37,auVar84,auVar97);
          auVar38._4_4_ = auVar97._4_4_ * auVar96._4_4_;
          auVar38._0_4_ = auVar97._0_4_ * auVar96._0_4_;
          auVar38._8_4_ = auVar97._8_4_ * auVar96._8_4_;
          auVar38._12_4_ = auVar97._12_4_ * auVar96._12_4_;
          auVar38._16_4_ = auVar97._16_4_ * auVar96._16_4_;
          auVar38._20_4_ = auVar97._20_4_ * auVar96._20_4_;
          auVar38._24_4_ = auVar97._24_4_ * auVar96._24_4_;
          auVar38._28_4_ = auVar97._28_4_;
          auVar78 = vfmsub231ps_fma(auVar38,auVar87,auVar85);
          auVar39._4_4_ = auVar84._4_4_ * auVar87._4_4_;
          auVar39._0_4_ = auVar84._0_4_ * auVar87._0_4_;
          auVar39._8_4_ = auVar84._8_4_ * auVar87._8_4_;
          auVar39._12_4_ = auVar84._12_4_ * auVar87._12_4_;
          auVar39._16_4_ = auVar84._16_4_ * auVar87._16_4_;
          auVar39._20_4_ = auVar84._20_4_ * auVar87._20_4_;
          auVar39._24_4_ = auVar84._24_4_ * auVar87._24_4_;
          auVar39._28_4_ = auVar84._28_4_;
          auVar202 = vfmsub231ps_fma(auVar39,auVar96,auVar101);
          auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar78),ZEXT1632(auVar202));
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar80),auVar100);
          auVar101 = vrcp14ps_avx512vl(auVar99);
          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar201 = ZEXT3264(auVar97);
          auVar96 = vfnmadd213ps_avx512vl(auVar101,auVar99,auVar97);
          auVar79 = vfmadd132ps_fma(auVar96,auVar101,auVar101);
          auVar40._4_4_ = auVar202._4_4_ * auVar98._4_4_;
          auVar40._0_4_ = auVar202._0_4_ * auVar98._0_4_;
          auVar40._8_4_ = auVar202._8_4_ * auVar98._8_4_;
          auVar40._12_4_ = auVar202._12_4_ * auVar98._12_4_;
          auVar40._16_4_ = fVar154 * 0.0;
          auVar40._20_4_ = fVar139 * 0.0;
          auVar40._24_4_ = fVar140 * 0.0;
          auVar40._28_4_ = iVar1;
          auVar78 = vfmadd231ps_fma(auVar40,auVar86,ZEXT1632(auVar78));
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar95,ZEXT1632(auVar80));
          fVar154 = auVar79._0_4_;
          fVar139 = auVar79._4_4_;
          fVar140 = auVar79._8_4_;
          fVar177 = auVar79._12_4_;
          local_380 = ZEXT1632(CONCAT412(auVar78._12_4_ * fVar177,
                                         CONCAT48(auVar78._8_4_ * fVar140,
                                                  CONCAT44(auVar78._4_4_ * fVar139,
                                                           auVar78._0_4_ * fVar154))));
          auVar183._4_4_ = uVar69;
          auVar183._0_4_ = uVar69;
          auVar183._8_4_ = uVar69;
          auVar183._12_4_ = uVar69;
          auVar183._16_4_ = uVar69;
          auVar183._20_4_ = uVar69;
          auVar183._24_4_ = uVar69;
          auVar183._28_4_ = uVar69;
          uVar141 = vcmpps_avx512vl(local_380,auVar91,2);
          uVar25 = vcmpps_avx512vl(auVar183,local_380,2);
          bVar72 = (byte)uVar141 & (byte)uVar25 & bVar72;
          auVar209 = ZEXT3264(local_5c0);
          auVar206 = ZEXT3264(local_5e0);
          auVar207 = ZEXT3264(local_600);
          auVar208 = ZEXT3264(local_620);
          auVar197 = ZEXT3264(auVar89);
          if (bVar72 != 0) {
            uVar141 = vcmpps_avx512vl(auVar99,auVar100,4);
            bVar72 = bVar72 & (byte)uVar141;
            if (bVar72 != 0) {
              fVar176 = auVar88._0_4_ * fVar154;
              fVar180 = auVar88._4_4_ * fVar139;
              auVar41._4_4_ = fVar180;
              auVar41._0_4_ = fVar176;
              fVar73 = auVar88._8_4_ * fVar140;
              auVar41._8_4_ = fVar73;
              fVar74 = auVar88._12_4_ * fVar177;
              auVar41._12_4_ = fVar74;
              fVar121 = auVar88._16_4_ * 0.0;
              auVar41._16_4_ = fVar121;
              fVar122 = auVar88._20_4_ * 0.0;
              auVar41._20_4_ = fVar122;
              fVar123 = auVar88._24_4_ * 0.0;
              auVar41._24_4_ = fVar123;
              auVar41._28_4_ = auVar99._28_4_;
              auVar101 = vsubps_avx512vl(auVar97,auVar41);
              local_3c0._0_4_ =
                   (float)((uint)(bVar62 & 1) * (int)fVar176 |
                          (uint)!(bool)(bVar62 & 1) * auVar101._0_4_);
              bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
              local_3c0._4_4_ =
                   (float)((uint)bVar12 * (int)fVar180 | (uint)!bVar12 * auVar101._4_4_);
              bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
              local_3c0._8_4_ = (float)((uint)bVar12 * (int)fVar73 | (uint)!bVar12 * auVar101._8_4_)
              ;
              bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
              local_3c0._12_4_ =
                   (float)((uint)bVar12 * (int)fVar74 | (uint)!bVar12 * auVar101._12_4_);
              bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
              local_3c0._16_4_ =
                   (float)((uint)bVar12 * (int)fVar121 | (uint)!bVar12 * auVar101._16_4_);
              bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
              local_3c0._20_4_ =
                   (float)((uint)bVar12 * (int)fVar122 | (uint)!bVar12 * auVar101._20_4_);
              bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
              local_3c0._24_4_ =
                   (float)((uint)bVar12 * (int)fVar123 | (uint)!bVar12 * auVar101._24_4_);
              bVar12 = SUB81(uVar63 >> 7,0);
              local_3c0._28_4_ =
                   (float)((uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar101._28_4_);
              auVar99 = vsubps_avx(ZEXT1632(auVar24),auVar92);
              auVar79 = vfmadd213ps_fma(auVar99,local_3c0,auVar92);
              uVar130 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar92._4_4_ = uVar130;
              auVar92._0_4_ = uVar130;
              auVar92._8_4_ = uVar130;
              auVar92._12_4_ = uVar130;
              auVar92._16_4_ = uVar130;
              auVar92._20_4_ = uVar130;
              auVar92._24_4_ = uVar130;
              auVar92._28_4_ = uVar130;
              auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                           CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                                                    CONCAT44(auVar79._4_4_ +
                                                                             auVar79._4_4_,
                                                                             auVar79._0_4_ +
                                                                             auVar79._0_4_)))),
                                        auVar92);
              uVar141 = vcmpps_avx512vl(local_380,auVar99,6);
              if (((byte)uVar141 & bVar72) != 0) {
                auVar157._0_4_ = auVar90._0_4_ * fVar154;
                auVar157._4_4_ = auVar90._4_4_ * fVar139;
                auVar157._8_4_ = auVar90._8_4_ * fVar140;
                auVar157._12_4_ = auVar90._12_4_ * fVar177;
                auVar157._16_4_ = auVar90._16_4_ * 0.0;
                auVar157._20_4_ = auVar90._20_4_ * 0.0;
                auVar157._24_4_ = auVar90._24_4_ * 0.0;
                auVar157._28_4_ = 0;
                auVar99 = vsubps_avx512vl(auVar97,auVar157);
                auVar110._0_4_ =
                     (uint)(bVar62 & 1) * (int)auVar157._0_4_ |
                     (uint)!(bool)(bVar62 & 1) * auVar99._0_4_;
                bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
                auVar110._4_4_ = (uint)bVar12 * (int)auVar157._4_4_ | (uint)!bVar12 * auVar99._4_4_;
                bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
                auVar110._8_4_ = (uint)bVar12 * (int)auVar157._8_4_ | (uint)!bVar12 * auVar99._8_4_;
                bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
                auVar110._12_4_ =
                     (uint)bVar12 * (int)auVar157._12_4_ | (uint)!bVar12 * auVar99._12_4_;
                bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
                auVar110._16_4_ =
                     (uint)bVar12 * (int)auVar157._16_4_ | (uint)!bVar12 * auVar99._16_4_;
                bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
                auVar110._20_4_ =
                     (uint)bVar12 * (int)auVar157._20_4_ | (uint)!bVar12 * auVar99._20_4_;
                bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
                auVar110._24_4_ =
                     (uint)bVar12 * (int)auVar157._24_4_ | (uint)!bVar12 * auVar99._24_4_;
                auVar110._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar99._28_4_;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_3a0 = vfmsub132ps_avx512vl(auVar110,auVar97,auVar34);
                local_360 = 0;
                local_350 = local_630._0_8_;
                uStack_348 = local_630._8_8_;
                local_340 = local_640._0_8_;
                uStack_338 = local_640._8_8_;
                local_330 = local_650._0_8_;
                uStack_328 = local_650._8_8_;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar66 = CONCAT71((int7)(uVar66 >> 8),1),
                     pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar154 = 1.0 / auVar93._0_4_;
                    local_300[0] = fVar154 * (local_3c0._0_4_ + 0.0);
                    local_300[1] = fVar154 * (local_3c0._4_4_ + 1.0);
                    local_300[2] = fVar154 * (local_3c0._8_4_ + 2.0);
                    local_300[3] = fVar154 * (local_3c0._12_4_ + 3.0);
                    fStack_2f0 = fVar154 * (local_3c0._16_4_ + 4.0);
                    fStack_2ec = fVar154 * (local_3c0._20_4_ + 5.0);
                    fStack_2e8 = fVar154 * (local_3c0._24_4_ + 6.0);
                    fStack_2e4 = local_3c0._28_4_ + 7.0;
                    local_2e0 = local_3a0;
                    local_2c0 = local_380;
                    uVar63 = 0;
                    uVar67 = (ulong)((byte)uVar141 & bVar72);
                    for (uVar68 = uVar67; (uVar68 & 1) == 0;
                        uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                      uVar63 = uVar63 + 1;
                    }
                    _local_400 = vpbroadcastd_avx512vl();
                    local_420 = vpbroadcastd_avx512vl();
                    local_540 = auVar89;
                    local_4e0 = auVar91;
                    local_35c = iVar8;
                    do {
                      auVar202 = auVar203._0_16_;
                      fVar154 = local_300[uVar63];
                      auVar146._4_4_ = fVar154;
                      auVar146._0_4_ = fVar154;
                      auVar146._8_4_ = fVar154;
                      auVar146._12_4_ = fVar154;
                      local_200._16_4_ = fVar154;
                      local_200._0_16_ = auVar146;
                      local_200._20_4_ = fVar154;
                      local_200._24_4_ = fVar154;
                      local_200._28_4_ = fVar154;
                      local_1e0 = *(undefined4 *)(local_2e0 + uVar63 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar63 * 4)
                      ;
                      local_6d0.context = context->user;
                      fVar139 = 1.0 - fVar154;
                      auVar31._8_4_ = 0x80000000;
                      auVar31._0_8_ = 0x8000000080000000;
                      auVar31._12_4_ = 0x80000000;
                      auVar80 = vxorps_avx512vl(ZEXT416((uint)fVar139),auVar31);
                      auVar79 = ZEXT416((uint)(fVar154 * fVar139 * 4.0));
                      auVar78 = vfnmsub213ss_fma(auVar146,auVar146,auVar79);
                      auVar79 = vfmadd213ss_fma(ZEXT416((uint)fVar139),ZEXT416((uint)fVar139),
                                                auVar79);
                      fVar139 = fVar139 * auVar80._0_4_ * 0.5;
                      fVar140 = auVar78._0_4_ * 0.5;
                      fVar177 = auVar79._0_4_ * 0.5;
                      fVar154 = fVar154 * fVar154 * 0.5;
                      auVar172._0_4_ = fVar154 * (float)local_4b0._0_4_;
                      auVar172._4_4_ = fVar154 * (float)local_4b0._4_4_;
                      auVar172._8_4_ = fVar154 * fStack_4a8;
                      auVar172._12_4_ = fVar154 * fStack_4a4;
                      auVar135._4_4_ = fVar177;
                      auVar135._0_4_ = fVar177;
                      auVar135._8_4_ = fVar177;
                      auVar135._12_4_ = fVar177;
                      auVar79 = vfmadd132ps_fma(auVar135,auVar172,local_650);
                      auVar161._4_4_ = fVar140;
                      auVar161._0_4_ = fVar140;
                      auVar161._8_4_ = fVar140;
                      auVar161._12_4_ = fVar140;
                      auVar79 = vfmadd132ps_fma(auVar161,auVar79,local_640);
                      auVar136._4_4_ = fVar139;
                      auVar136._0_4_ = fVar139;
                      auVar136._8_4_ = fVar139;
                      auVar136._12_4_ = fVar139;
                      auVar79 = vfmadd132ps_fma(auVar136,auVar79,local_630);
                      local_260 = auVar79._0_4_;
                      auVar165._8_4_ = 1;
                      auVar165._0_8_ = 0x100000001;
                      auVar165._12_4_ = 1;
                      auVar165._16_4_ = 1;
                      auVar165._20_4_ = 1;
                      auVar165._24_4_ = 1;
                      auVar165._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar165,ZEXT1632(auVar79));
                      auVar174._8_4_ = 2;
                      auVar174._0_8_ = 0x200000002;
                      auVar174._12_4_ = 2;
                      auVar174._16_4_ = 2;
                      auVar174._20_4_ = 2;
                      auVar174._24_4_ = 2;
                      auVar174._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar174,ZEXT1632(auVar79));
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_420._0_8_;
                      uStack_1b8 = local_420._8_8_;
                      uStack_1b0 = local_420._16_8_;
                      uStack_1a8 = local_420._24_8_;
                      local_1a0 = _local_400;
                      vpcmpeqd_avx2(_local_400,_local_400);
                      local_180 = (local_6d0.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_6d0.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_5a0 = local_280;
                      local_6d0.valid = (int *)local_5a0;
                      local_6d0.geometryUserPtr = pGVar9->userPtr;
                      local_6d0.hit = (RTCHitN *)&local_260;
                      local_6d0.N = 8;
                      local_480 = (float)uVar67;
                      fStack_47c = (float)(uVar67 >> 0x20);
                      local_4a0 = (uint)uVar63;
                      uStack_49c = (uint)(uVar63 >> 0x20);
                      local_6d0.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->occlusionFilterN)(&local_6d0);
                        uVar63 = CONCAT44(uStack_49c,local_4a0);
                        uVar67 = CONCAT44(fStack_47c,local_480);
                        auVar198 = ZEXT3264(local_4e0);
                        auVar197 = ZEXT3264(local_540);
                        auVar208 = ZEXT3264(local_620);
                        auVar207 = ZEXT3264(local_600);
                        auVar206 = ZEXT3264(local_5e0);
                        auVar209 = ZEXT3264(local_5c0);
                        auVar199 = ZEXT3264(local_6a0);
                        auVar200 = ZEXT3264(local_680);
                        auVar205 = ZEXT3264(local_520);
                        auVar204 = ZEXT3264(local_500);
                        auVar79 = vxorps_avx512vl(auVar202,auVar202);
                        auVar203 = ZEXT1664(auVar79);
                        uVar69 = local_560._0_4_;
                      }
                      auVar79 = auVar203._0_16_;
                      if (local_5a0 == (undefined1  [32])0x0) {
                        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar201 = ZEXT3264(auVar99);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if (p_Var11 == (RTCFilterFunctionN)0x0) {
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar201 = ZEXT3264(auVar99);
                        }
                        else {
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar201 = ZEXT3264(auVar99);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var11)(&local_6d0);
                            uVar63 = CONCAT44(uStack_49c,local_4a0);
                            uVar67 = CONCAT44(fStack_47c,local_480);
                            auVar198 = ZEXT3264(local_4e0);
                            auVar197 = ZEXT3264(local_540);
                            auVar208 = ZEXT3264(local_620);
                            auVar207 = ZEXT3264(local_600);
                            auVar206 = ZEXT3264(local_5e0);
                            auVar209 = ZEXT3264(local_5c0);
                            auVar199 = ZEXT3264(local_6a0);
                            auVar200 = ZEXT3264(local_680);
                            auVar205 = ZEXT3264(local_520);
                            auVar204 = ZEXT3264(local_500);
                            auVar79 = vxorps_avx512vl(auVar79,auVar79);
                            auVar203 = ZEXT1664(auVar79);
                            auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar201 = ZEXT3264(auVar99);
                            uVar69 = local_560._0_4_;
                          }
                        }
                        auVar89 = auVar197._0_32_;
                        uVar68 = vptestmd_avx512vl(local_5a0,local_5a0);
                        auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar68 & 1);
                        bVar13 = (bool)((byte)(uVar68 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar68 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar68 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar68 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar68 >> 6) & 1);
                        bVar19 = SUB81(uVar68 >> 7,0);
                        *(uint *)(local_6d0.ray + 0x100) =
                             (uint)bVar12 * auVar99._0_4_ |
                             (uint)!bVar12 * *(int *)(local_6d0.ray + 0x100);
                        *(uint *)(local_6d0.ray + 0x104) =
                             (uint)bVar13 * auVar99._4_4_ |
                             (uint)!bVar13 * *(int *)(local_6d0.ray + 0x104);
                        *(uint *)(local_6d0.ray + 0x108) =
                             (uint)bVar14 * auVar99._8_4_ |
                             (uint)!bVar14 * *(int *)(local_6d0.ray + 0x108);
                        *(uint *)(local_6d0.ray + 0x10c) =
                             (uint)bVar15 * auVar99._12_4_ |
                             (uint)!bVar15 * *(int *)(local_6d0.ray + 0x10c);
                        *(uint *)(local_6d0.ray + 0x110) =
                             (uint)bVar16 * auVar99._16_4_ |
                             (uint)!bVar16 * *(int *)(local_6d0.ray + 0x110);
                        *(uint *)(local_6d0.ray + 0x114) =
                             (uint)bVar17 * auVar99._20_4_ |
                             (uint)!bVar17 * *(int *)(local_6d0.ray + 0x114);
                        *(uint *)(local_6d0.ray + 0x118) =
                             (uint)bVar18 * auVar99._24_4_ |
                             (uint)!bVar18 * *(int *)(local_6d0.ray + 0x118);
                        *(uint *)(local_6d0.ray + 0x11c) =
                             (uint)bVar19 * auVar99._28_4_ |
                             (uint)!bVar19 * *(int *)(local_6d0.ray + 0x11c);
                        if (local_5a0 != (undefined1  [32])0x0) {
                          uVar66 = CONCAT71((int7)(uVar66 >> 8),1);
                          break;
                        }
                      }
                      auVar89 = auVar197._0_32_;
                      *(int *)(ray + k * 4 + 0x100) = auVar198._0_4_;
                      uVar68 = uVar63 & 0x3f;
                      uVar66 = 0;
                      uVar63 = 0;
                      uVar67 = uVar67 ^ 1L << uVar68;
                      for (uVar68 = uVar67; (uVar68 & 1) == 0;
                          uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                        uVar63 = uVar63 + 1;
                      }
                    } while (uVar67 != 0);
                  }
                  goto LAB_01bbaa5f;
                }
              }
            }
          }
          uVar66 = 0;
        }
      }
LAB_01bbaa5f:
      if (8 < iVar8) {
        local_560 = vpbroadcastd_avx512vl();
        local_400._4_4_ = 1.0 / (float)local_460._0_4_;
        local_400._0_4_ = local_400._4_4_;
        fStack_3f8 = (float)local_400._4_4_;
        fStack_3f4 = (float)local_400._4_4_;
        fStack_3f0 = (float)local_400._4_4_;
        fStack_3ec = (float)local_400._4_4_;
        fStack_3e8 = (float)local_400._4_4_;
        fStack_3e4 = (float)local_400._4_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar70 = 8;
        local_540 = auVar89;
        local_4a0 = uVar69;
        uStack_49c = uVar69;
        uStack_498 = uVar69;
        uStack_494 = uVar69;
        uStack_490 = uVar69;
        uStack_48c = uVar69;
        uStack_488 = uVar69;
        uStack_484 = uVar69;
        local_480 = fVar129;
        fStack_47c = fVar129;
        fStack_478 = fVar129;
        fStack_474 = fVar129;
        fStack_470 = fVar129;
        fStack_46c = fVar129;
        fStack_468 = fVar129;
        fStack_464 = fVar129;
        do {
          auVar99 = vpbroadcastd_avx512vl();
          auVar84 = vpor_avx2(auVar99,_DAT_01fe9900);
          uVar25 = vpcmpd_avx512vl(auVar84,local_560,1);
          auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 * 4 + lVar26);
          auVar101 = *(undefined1 (*) [32])(lVar26 + 0x21aefac + lVar70 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar26 + 0x21af430 + lVar70 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar26 + 0x21af8b4 + lVar70 * 4);
          local_600 = auVar207._0_32_;
          auVar85 = vmulps_avx512vl(local_600,auVar96);
          local_620 = auVar208._0_32_;
          auVar95 = vmulps_avx512vl(local_620,auVar96);
          auVar42._4_4_ = auVar96._4_4_ * (float)local_e0._4_4_;
          auVar42._0_4_ = auVar96._0_4_ * (float)local_e0._0_4_;
          auVar42._8_4_ = auVar96._8_4_ * fStack_d8;
          auVar42._12_4_ = auVar96._12_4_ * fStack_d4;
          auVar42._16_4_ = auVar96._16_4_ * fStack_d0;
          auVar42._20_4_ = auVar96._20_4_ * fStack_cc;
          auVar42._24_4_ = auVar96._24_4_ * fStack_c8;
          auVar42._28_4_ = auVar84._28_4_;
          local_5c0 = auVar209._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar85,auVar97,local_5c0);
          local_5e0 = auVar206._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar95,auVar97,local_5e0);
          auVar95 = vfmadd231ps_avx512vl(auVar42,auVar97,local_c0);
          auVar102 = auVar200._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar101,auVar102);
          auVar100 = auVar199._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar101,auVar100);
          auVar79 = vfmadd231ps_fma(auVar95,auVar101,local_a0);
          auVar103 = auVar204._0_32_;
          auVar88 = vfmadd231ps_avx512vl(auVar84,auVar99,auVar103);
          auVar104 = auVar205._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar85,auVar99,auVar104);
          auVar84 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 * 4 + lVar26);
          auVar85 = *(undefined1 (*) [32])(lVar26 + 0x21b13cc + lVar70 * 4);
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar99,local_80);
          auVar95 = *(undefined1 (*) [32])(lVar26 + 0x21b1850 + lVar70 * 4);
          auVar86 = *(undefined1 (*) [32])(lVar26 + 0x21b1cd4 + lVar70 * 4);
          auVar89 = vmulps_avx512vl(local_600,auVar86);
          auVar87 = vmulps_avx512vl(local_620,auVar86);
          auVar43._4_4_ = auVar86._4_4_ * (float)local_e0._4_4_;
          auVar43._0_4_ = auVar86._0_4_ * (float)local_e0._0_4_;
          auVar43._8_4_ = auVar86._8_4_ * fStack_d8;
          auVar43._12_4_ = auVar86._12_4_ * fStack_d4;
          auVar43._16_4_ = auVar86._16_4_ * fStack_d0;
          auVar43._20_4_ = auVar86._20_4_ * fStack_cc;
          auVar43._24_4_ = auVar86._24_4_ * fStack_c8;
          auVar43._28_4_ = uStack_c4;
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar95,local_5c0);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar95,local_5e0);
          auVar91 = vfmadd231ps_avx512vl(auVar43,auVar95,local_c0);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar85,auVar102);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar100);
          auVar78 = vfmadd231ps_fma(auVar91,auVar85,local_a0);
          auVar91 = vfmadd231ps_avx512vl(auVar89,auVar84,auVar103);
          auVar92 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar104);
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar84,local_80);
          auVar93 = vmaxps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar78));
          auVar89 = vsubps_avx(auVar91,auVar88);
          auVar87 = vsubps_avx(auVar92,auVar90);
          auVar94 = vmulps_avx512vl(auVar90,auVar89);
          auVar98 = vmulps_avx512vl(auVar88,auVar87);
          auVar94 = vsubps_avx512vl(auVar94,auVar98);
          auVar98 = vmulps_avx512vl(auVar87,auVar87);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,auVar89);
          auVar93 = vmulps_avx512vl(auVar93,auVar93);
          auVar93 = vmulps_avx512vl(auVar93,auVar98);
          auVar94 = vmulps_avx512vl(auVar94,auVar94);
          uVar141 = vcmpps_avx512vl(auVar94,auVar93,2);
          bVar72 = (byte)uVar25 & (byte)uVar141;
          if (bVar72 == 0) {
            auVar200 = ZEXT3264(auVar102);
            auVar199 = ZEXT3264(auVar100);
          }
          else {
            auVar86 = vmulps_avx512vl(local_540,auVar86);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar86);
            auVar85 = vfmadd213ps_avx512vl(auVar85,local_120,auVar95);
            auVar84 = vfmadd213ps_avx512vl(auVar84,local_100,auVar85);
            auVar96 = vmulps_avx512vl(local_540,auVar96);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_140,auVar96);
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_120,auVar97);
            auVar85 = vfmadd213ps_avx512vl(auVar99,local_100,auVar101);
            auVar99 = *(undefined1 (*) [32])(lVar26 + 0x21afd38 + lVar70 * 4);
            auVar101 = *(undefined1 (*) [32])(lVar26 + 0x21b01bc + lVar70 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar26 + 0x21b0640 + lVar70 * 4);
            auVar96 = *(undefined1 (*) [32])(lVar26 + 0x21b0ac4 + lVar70 * 4);
            auVar95 = vmulps_avx512vl(local_600,auVar96);
            auVar86 = vmulps_avx512vl(local_620,auVar96);
            auVar96 = vmulps_avx512vl(local_540,auVar96);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar97,local_5c0);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar97,local_5e0);
            auVar97 = vfmadd231ps_avx512vl(auVar96,local_140,auVar97);
            auVar96 = vfmadd231ps_avx512vl(auVar95,auVar101,auVar102);
            auVar95 = vfmadd231ps_avx512vl(auVar86,auVar101,auVar100);
            auVar101 = vfmadd231ps_avx512vl(auVar97,local_120,auVar101);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar103);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar104);
            auVar86 = vfmadd231ps_avx512vl(auVar101,local_100,auVar99);
            auVar99 = *(undefined1 (*) [32])(lVar26 + 0x21b2158 + lVar70 * 4);
            auVar101 = *(undefined1 (*) [32])(lVar26 + 0x21b2a60 + lVar70 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar26 + 0x21b2ee4 + lVar70 * 4);
            auVar93 = vmulps_avx512vl(local_600,auVar97);
            auVar94 = vmulps_avx512vl(local_620,auVar97);
            auVar97 = vmulps_avx512vl(local_540,auVar97);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar101,local_5c0);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_5e0);
            auVar97 = vfmadd231ps_avx512vl(auVar97,local_140,auVar101);
            auVar101 = *(undefined1 (*) [32])(lVar26 + 0x21b25dc + lVar70 * 4);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar101,auVar102);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,auVar100);
            auVar101 = vfmadd231ps_avx512vl(auVar97,local_120,auVar101);
            auVar97 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar103);
            auVar93 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar104);
            auVar101 = vfmadd231ps_avx512vl(auVar101,local_100,auVar99);
            auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar96,auVar94);
            vandps_avx512vl(auVar95,auVar94);
            auVar99 = vmaxps_avx(auVar94,auVar94);
            vandps_avx512vl(auVar86,auVar94);
            auVar99 = vmaxps_avx(auVar99,auVar94);
            auVar61._4_4_ = fStack_47c;
            auVar61._0_4_ = local_480;
            auVar61._8_4_ = fStack_478;
            auVar61._12_4_ = fStack_474;
            auVar61._16_4_ = fStack_470;
            auVar61._20_4_ = fStack_46c;
            auVar61._24_4_ = fStack_468;
            auVar61._28_4_ = fStack_464;
            uVar63 = vcmpps_avx512vl(auVar99,auVar61,1);
            bVar12 = (bool)((byte)uVar63 & 1);
            auVar111._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar96._0_4_);
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar96._4_4_);
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar96._8_4_);
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar96._12_4_);
            bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar111._16_4_ =
                 (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar96._16_4_);
            bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar111._20_4_ =
                 (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar96._20_4_);
            bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar111._24_4_ =
                 (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar96._24_4_);
            bVar12 = SUB81(uVar63 >> 7,0);
            auVar111._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar96._28_4_;
            bVar12 = (bool)((byte)uVar63 & 1);
            auVar112._0_4_ = (float)((uint)bVar12 * auVar87._0_4_ | (uint)!bVar12 * auVar95._0_4_);
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar12 * auVar87._4_4_ | (uint)!bVar12 * auVar95._4_4_);
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar12 * auVar87._8_4_ | (uint)!bVar12 * auVar95._8_4_);
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar12 * auVar87._12_4_ | (uint)!bVar12 * auVar95._12_4_);
            bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar112._16_4_ =
                 (float)((uint)bVar12 * auVar87._16_4_ | (uint)!bVar12 * auVar95._16_4_);
            bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar112._20_4_ =
                 (float)((uint)bVar12 * auVar87._20_4_ | (uint)!bVar12 * auVar95._20_4_);
            bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar112._24_4_ =
                 (float)((uint)bVar12 * auVar87._24_4_ | (uint)!bVar12 * auVar95._24_4_);
            bVar12 = SUB81(uVar63 >> 7,0);
            auVar112._28_4_ = (uint)bVar12 * auVar87._28_4_ | (uint)!bVar12 * auVar95._28_4_;
            vandps_avx512vl(auVar97,auVar94);
            vandps_avx512vl(auVar93,auVar94);
            auVar99 = vmaxps_avx(auVar112,auVar112);
            vandps_avx512vl(auVar101,auVar94);
            auVar99 = vmaxps_avx(auVar99,auVar112);
            uVar63 = vcmpps_avx512vl(auVar99,auVar61,1);
            bVar12 = (bool)((byte)uVar63 & 1);
            auVar113._0_4_ = (uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar97._0_4_;
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar113._4_4_ = (uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar97._4_4_;
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar113._8_4_ = (uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar97._8_4_;
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar113._12_4_ = (uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar97._12_4_;
            bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar113._16_4_ = (uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar97._16_4_;
            bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar113._20_4_ = (uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar97._20_4_;
            bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar113._24_4_ = (uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar97._24_4_;
            bVar12 = SUB81(uVar63 >> 7,0);
            auVar113._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar97._28_4_;
            bVar12 = (bool)((byte)uVar63 & 1);
            auVar114._0_4_ = (float)((uint)bVar12 * auVar87._0_4_ | (uint)!bVar12 * auVar93._0_4_);
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar12 * auVar87._4_4_ | (uint)!bVar12 * auVar93._4_4_);
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar12 * auVar87._8_4_ | (uint)!bVar12 * auVar93._8_4_);
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar12 * auVar87._12_4_ | (uint)!bVar12 * auVar93._12_4_);
            bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar114._16_4_ =
                 (float)((uint)bVar12 * auVar87._16_4_ | (uint)!bVar12 * auVar93._16_4_);
            bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar114._20_4_ =
                 (float)((uint)bVar12 * auVar87._20_4_ | (uint)!bVar12 * auVar93._20_4_);
            bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar114._24_4_ =
                 (float)((uint)bVar12 * auVar87._24_4_ | (uint)!bVar12 * auVar93._24_4_);
            bVar12 = SUB81(uVar63 >> 7,0);
            auVar114._28_4_ = (uint)bVar12 * auVar87._28_4_ | (uint)!bVar12 * auVar93._28_4_;
            auVar187._8_4_ = 0x80000000;
            auVar187._0_8_ = 0x8000000080000000;
            auVar187._12_4_ = 0x80000000;
            auVar187._16_4_ = 0x80000000;
            auVar187._20_4_ = 0x80000000;
            auVar187._24_4_ = 0x80000000;
            auVar187._28_4_ = 0x80000000;
            auVar99 = vxorps_avx512vl(auVar113,auVar187);
            auVar93 = auVar203._0_32_;
            auVar101 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar93);
            auVar80 = vfmadd231ps_fma(auVar101,auVar112,auVar112);
            auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
            auVar196._8_4_ = 0xbf000000;
            auVar196._0_8_ = 0xbf000000bf000000;
            auVar196._12_4_ = 0xbf000000;
            auVar196._16_4_ = 0xbf000000;
            auVar196._20_4_ = 0xbf000000;
            auVar196._24_4_ = 0xbf000000;
            auVar196._28_4_ = 0xbf000000;
            fVar129 = auVar101._0_4_;
            fVar154 = auVar101._4_4_;
            fVar139 = auVar101._8_4_;
            fVar140 = auVar101._12_4_;
            fVar177 = auVar101._16_4_;
            fVar176 = auVar101._20_4_;
            fVar180 = auVar101._24_4_;
            auVar44._4_4_ = fVar154 * fVar154 * fVar154 * auVar80._4_4_ * -0.5;
            auVar44._0_4_ = fVar129 * fVar129 * fVar129 * auVar80._0_4_ * -0.5;
            auVar44._8_4_ = fVar139 * fVar139 * fVar139 * auVar80._8_4_ * -0.5;
            auVar44._12_4_ = fVar140 * fVar140 * fVar140 * auVar80._12_4_ * -0.5;
            auVar44._16_4_ = fVar177 * fVar177 * fVar177 * -0.0;
            auVar44._20_4_ = fVar176 * fVar176 * fVar176 * -0.0;
            auVar44._24_4_ = fVar180 * fVar180 * fVar180 * -0.0;
            auVar44._28_4_ = auVar112._28_4_;
            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar101 = vfmadd231ps_avx512vl(auVar44,auVar97,auVar101);
            auVar45._4_4_ = auVar112._4_4_ * auVar101._4_4_;
            auVar45._0_4_ = auVar112._0_4_ * auVar101._0_4_;
            auVar45._8_4_ = auVar112._8_4_ * auVar101._8_4_;
            auVar45._12_4_ = auVar112._12_4_ * auVar101._12_4_;
            auVar45._16_4_ = auVar112._16_4_ * auVar101._16_4_;
            auVar45._20_4_ = auVar112._20_4_ * auVar101._20_4_;
            auVar45._24_4_ = auVar112._24_4_ * auVar101._24_4_;
            auVar45._28_4_ = 0;
            auVar46._4_4_ = auVar101._4_4_ * -auVar111._4_4_;
            auVar46._0_4_ = auVar101._0_4_ * -auVar111._0_4_;
            auVar46._8_4_ = auVar101._8_4_ * -auVar111._8_4_;
            auVar46._12_4_ = auVar101._12_4_ * -auVar111._12_4_;
            auVar46._16_4_ = auVar101._16_4_ * -auVar111._16_4_;
            auVar46._20_4_ = auVar101._20_4_ * -auVar111._20_4_;
            auVar46._24_4_ = auVar101._24_4_ * -auVar111._24_4_;
            auVar46._28_4_ = auVar112._28_4_;
            auVar96 = vmulps_avx512vl(auVar101,auVar93);
            auVar101 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar93);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar114,auVar114);
            auVar95 = vrsqrt14ps_avx512vl(auVar101);
            auVar101 = vmulps_avx512vl(auVar101,auVar196);
            fVar129 = auVar95._0_4_;
            fVar154 = auVar95._4_4_;
            fVar139 = auVar95._8_4_;
            fVar140 = auVar95._12_4_;
            fVar177 = auVar95._16_4_;
            fVar176 = auVar95._20_4_;
            fVar180 = auVar95._24_4_;
            auVar47._4_4_ = fVar154 * fVar154 * fVar154 * auVar101._4_4_;
            auVar47._0_4_ = fVar129 * fVar129 * fVar129 * auVar101._0_4_;
            auVar47._8_4_ = fVar139 * fVar139 * fVar139 * auVar101._8_4_;
            auVar47._12_4_ = fVar140 * fVar140 * fVar140 * auVar101._12_4_;
            auVar47._16_4_ = fVar177 * fVar177 * fVar177 * auVar101._16_4_;
            auVar47._20_4_ = fVar176 * fVar176 * fVar176 * auVar101._20_4_;
            auVar47._24_4_ = fVar180 * fVar180 * fVar180 * auVar101._24_4_;
            auVar47._28_4_ = auVar101._28_4_;
            auVar101 = vfmadd231ps_avx512vl(auVar47,auVar97,auVar95);
            auVar48._4_4_ = auVar114._4_4_ * auVar101._4_4_;
            auVar48._0_4_ = auVar114._0_4_ * auVar101._0_4_;
            auVar48._8_4_ = auVar114._8_4_ * auVar101._8_4_;
            auVar48._12_4_ = auVar114._12_4_ * auVar101._12_4_;
            auVar48._16_4_ = auVar114._16_4_ * auVar101._16_4_;
            auVar48._20_4_ = auVar114._20_4_ * auVar101._20_4_;
            auVar48._24_4_ = auVar114._24_4_ * auVar101._24_4_;
            auVar48._28_4_ = auVar95._28_4_;
            auVar49._4_4_ = auVar101._4_4_ * auVar99._4_4_;
            auVar49._0_4_ = auVar101._0_4_ * auVar99._0_4_;
            auVar49._8_4_ = auVar101._8_4_ * auVar99._8_4_;
            auVar49._12_4_ = auVar101._12_4_ * auVar99._12_4_;
            auVar49._16_4_ = auVar101._16_4_ * auVar99._16_4_;
            auVar49._20_4_ = auVar101._20_4_ * auVar99._20_4_;
            auVar49._24_4_ = auVar101._24_4_ * auVar99._24_4_;
            auVar49._28_4_ = auVar99._28_4_;
            auVar99 = vmulps_avx512vl(auVar101,auVar93);
            auVar80 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar79),auVar88);
            auVar101 = ZEXT1632(auVar79);
            auVar202 = vfmadd213ps_fma(auVar46,auVar101,auVar90);
            auVar97 = vfmadd213ps_avx512vl(auVar96,auVar101,auVar85);
            auVar95 = vfmadd213ps_avx512vl(auVar48,ZEXT1632(auVar78),auVar91);
            auVar24 = vfnmadd213ps_fma(auVar45,auVar101,auVar88);
            auVar86 = ZEXT1632(auVar78);
            auVar20 = vfmadd213ps_fma(auVar49,auVar86,auVar92);
            auVar81 = vfnmadd213ps_fma(auVar46,auVar101,auVar90);
            auVar21 = vfmadd213ps_fma(auVar99,auVar86,auVar84);
            auVar90 = ZEXT1632(auVar79);
            auVar83 = vfnmadd231ps_fma(auVar85,auVar90,auVar96);
            auVar82 = vfnmadd213ps_fma(auVar48,auVar86,auVar91);
            auVar28 = vfnmadd213ps_fma(auVar49,auVar86,auVar92);
            auVar29 = vfnmadd231ps_fma(auVar84,ZEXT1632(auVar78),auVar99);
            auVar84 = vsubps_avx512vl(auVar95,ZEXT1632(auVar24));
            auVar99 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar81));
            auVar101 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar83));
            auVar50._4_4_ = auVar99._4_4_ * auVar83._4_4_;
            auVar50._0_4_ = auVar99._0_4_ * auVar83._0_4_;
            auVar50._8_4_ = auVar99._8_4_ * auVar83._8_4_;
            auVar50._12_4_ = auVar99._12_4_ * auVar83._12_4_;
            auVar50._16_4_ = auVar99._16_4_ * 0.0;
            auVar50._20_4_ = auVar99._20_4_ * 0.0;
            auVar50._24_4_ = auVar99._24_4_ * 0.0;
            auVar50._28_4_ = auVar96._28_4_;
            auVar79 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar81),auVar101);
            auVar51._4_4_ = auVar101._4_4_ * auVar24._4_4_;
            auVar51._0_4_ = auVar101._0_4_ * auVar24._0_4_;
            auVar51._8_4_ = auVar101._8_4_ * auVar24._8_4_;
            auVar51._12_4_ = auVar101._12_4_ * auVar24._12_4_;
            auVar51._16_4_ = auVar101._16_4_ * 0.0;
            auVar51._20_4_ = auVar101._20_4_ * 0.0;
            auVar51._24_4_ = auVar101._24_4_ * 0.0;
            auVar51._28_4_ = auVar101._28_4_;
            auVar22 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar83),auVar84);
            auVar52._4_4_ = auVar81._4_4_ * auVar84._4_4_;
            auVar52._0_4_ = auVar81._0_4_ * auVar84._0_4_;
            auVar52._8_4_ = auVar81._8_4_ * auVar84._8_4_;
            auVar52._12_4_ = auVar81._12_4_ * auVar84._12_4_;
            auVar52._16_4_ = auVar84._16_4_ * 0.0;
            auVar52._20_4_ = auVar84._20_4_ * 0.0;
            auVar52._24_4_ = auVar84._24_4_ * 0.0;
            auVar52._28_4_ = auVar84._28_4_;
            auVar23 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar24),auVar99);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar93,ZEXT1632(auVar22));
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar79));
            uVar63 = vcmpps_avx512vl(auVar99,auVar93,2);
            bVar62 = (byte)uVar63;
            fVar121 = (float)((uint)(bVar62 & 1) * auVar80._0_4_ |
                             (uint)!(bool)(bVar62 & 1) * auVar82._0_4_);
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            fVar123 = (float)((uint)bVar12 * auVar80._4_4_ | (uint)!bVar12 * auVar82._4_4_);
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            fVar125 = (float)((uint)bVar12 * auVar80._8_4_ | (uint)!bVar12 * auVar82._8_4_);
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            fVar127 = (float)((uint)bVar12 * auVar80._12_4_ | (uint)!bVar12 * auVar82._12_4_);
            auVar86 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar125,CONCAT44(fVar123,fVar121))));
            fVar122 = (float)((uint)(bVar62 & 1) * auVar202._0_4_ |
                             (uint)!(bool)(bVar62 & 1) * auVar28._0_4_);
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            fVar124 = (float)((uint)bVar12 * auVar202._4_4_ | (uint)!bVar12 * auVar28._4_4_);
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            fVar126 = (float)((uint)bVar12 * auVar202._8_4_ | (uint)!bVar12 * auVar28._8_4_);
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            fVar128 = (float)((uint)bVar12 * auVar202._12_4_ | (uint)!bVar12 * auVar28._12_4_);
            auVar89 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar122))));
            auVar115._0_4_ =
                 (float)((uint)(bVar62 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar29._0_4_);
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar29._4_4_);
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar29._8_4_);
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar29._12_4_);
            fVar139 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar97._16_4_);
            auVar115._16_4_ = fVar139;
            fVar129 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar97._20_4_);
            auVar115._20_4_ = fVar129;
            fVar154 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar97._24_4_);
            auVar115._24_4_ = fVar154;
            iVar1 = (uint)(byte)(uVar63 >> 7) * auVar97._28_4_;
            auVar115._28_4_ = iVar1;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar24),auVar95);
            auVar116._0_4_ =
                 (uint)(bVar62 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar79._0_4_;
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar116._4_4_ = (uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar79._4_4_;
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar116._8_4_ = (uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar79._8_4_;
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar116._12_4_ = (uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar79._12_4_;
            auVar116._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar99._16_4_;
            auVar116._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar99._20_4_;
            auVar116._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar99._24_4_;
            auVar116._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar99._28_4_;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar20));
            auVar117._0_4_ =
                 (float)((uint)(bVar62 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar80._0_4_);
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar80._4_4_);
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar80._8_4_);
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar80._12_4_);
            fVar140 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar99._16_4_);
            auVar117._16_4_ = fVar140;
            fVar177 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar99._20_4_);
            auVar117._20_4_ = fVar177;
            fVar176 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar99._24_4_);
            auVar117._24_4_ = fVar176;
            auVar117._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar99._28_4_;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar21));
            auVar118._0_4_ =
                 (float)((uint)(bVar62 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar202._0_4_);
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar202._4_4_);
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar202._8_4_);
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar202._12_4_);
            fVar180 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar99._16_4_);
            auVar118._16_4_ = fVar180;
            fVar73 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar99._20_4_);
            auVar118._20_4_ = fVar73;
            fVar74 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar99._24_4_);
            auVar118._24_4_ = fVar74;
            iVar2 = (uint)(byte)(uVar63 >> 7) * auVar99._28_4_;
            auVar118._28_4_ = iVar2;
            auVar119._0_4_ =
                 (uint)(bVar62 & 1) * (int)auVar24._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar95._0_4_
            ;
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar12 * (int)auVar24._4_4_ | (uint)!bVar12 * auVar95._4_4_;
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar12 * (int)auVar24._8_4_ | (uint)!bVar12 * auVar95._8_4_;
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar12 * (int)auVar24._12_4_ | (uint)!bVar12 * auVar95._12_4_;
            auVar119._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar95._16_4_;
            auVar119._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar95._20_4_;
            auVar119._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar95._24_4_;
            auVar119._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar95._28_4_;
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar63 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar63 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar63 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar95 = vsubps_avx512vl(auVar119,auVar86);
            auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar81._12_4_ |
                                                     (uint)!bVar16 * auVar20._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar81._8_4_ |
                                                              (uint)!bVar14 * auVar20._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar81._4_4_ |
                                                                       (uint)!bVar12 * auVar20._4_4_
                                                                       ,(uint)(bVar62 & 1) *
                                                                        (int)auVar81._0_4_ |
                                                                        (uint)!(bool)(bVar62 & 1) *
                                                                        auVar20._0_4_)))),auVar89);
            auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar83._12_4_ |
                                                    (uint)!bVar17 * auVar21._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar83._8_4_ |
                                                             (uint)!bVar15 * auVar21._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar83._4_4_ |
                                                                      (uint)!bVar13 * auVar21._4_4_,
                                                                      (uint)(bVar62 & 1) *
                                                                      (int)auVar83._0_4_ |
                                                                      (uint)!(bool)(bVar62 & 1) *
                                                                      auVar21._0_4_)))),auVar115);
            auVar96 = vsubps_avx(auVar86,auVar116);
            auVar84 = vsubps_avx(auVar89,auVar117);
            auVar85 = vsubps_avx(auVar115,auVar118);
            auVar53._4_4_ = auVar97._4_4_ * fVar123;
            auVar53._0_4_ = auVar97._0_4_ * fVar121;
            auVar53._8_4_ = auVar97._8_4_ * fVar125;
            auVar53._12_4_ = auVar97._12_4_ * fVar127;
            auVar53._16_4_ = auVar97._16_4_ * 0.0;
            auVar53._20_4_ = auVar97._20_4_ * 0.0;
            auVar53._24_4_ = auVar97._24_4_ * 0.0;
            auVar53._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar53,auVar115,auVar95);
            auVar158._0_4_ = fVar122 * auVar95._0_4_;
            auVar158._4_4_ = fVar124 * auVar95._4_4_;
            auVar158._8_4_ = fVar126 * auVar95._8_4_;
            auVar158._12_4_ = fVar128 * auVar95._12_4_;
            auVar158._16_4_ = auVar95._16_4_ * 0.0;
            auVar158._20_4_ = auVar95._20_4_ * 0.0;
            auVar158._24_4_ = auVar95._24_4_ * 0.0;
            auVar158._28_4_ = 0;
            auVar80 = vfmsub231ps_fma(auVar158,auVar86,auVar101);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar93,ZEXT1632(auVar79));
            auVar166._0_4_ = auVar101._0_4_ * auVar115._0_4_;
            auVar166._4_4_ = auVar101._4_4_ * auVar115._4_4_;
            auVar166._8_4_ = auVar101._8_4_ * auVar115._8_4_;
            auVar166._12_4_ = auVar101._12_4_ * auVar115._12_4_;
            auVar166._16_4_ = auVar101._16_4_ * fVar139;
            auVar166._20_4_ = auVar101._20_4_ * fVar129;
            auVar166._24_4_ = auVar101._24_4_ * fVar154;
            auVar166._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar166,auVar89,auVar97);
            auVar87 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar79));
            auVar99 = vmulps_avx512vl(auVar85,auVar116);
            auVar99 = vfmsub231ps_avx512vl(auVar99,auVar96,auVar118);
            auVar54._4_4_ = auVar84._4_4_ * auVar118._4_4_;
            auVar54._0_4_ = auVar84._0_4_ * auVar118._0_4_;
            auVar54._8_4_ = auVar84._8_4_ * auVar118._8_4_;
            auVar54._12_4_ = auVar84._12_4_ * auVar118._12_4_;
            auVar54._16_4_ = auVar84._16_4_ * fVar180;
            auVar54._20_4_ = auVar84._20_4_ * fVar73;
            auVar54._24_4_ = auVar84._24_4_ * fVar74;
            auVar54._28_4_ = iVar2;
            auVar79 = vfmsub231ps_fma(auVar54,auVar117,auVar85);
            auVar167._0_4_ = auVar117._0_4_ * auVar96._0_4_;
            auVar167._4_4_ = auVar117._4_4_ * auVar96._4_4_;
            auVar167._8_4_ = auVar117._8_4_ * auVar96._8_4_;
            auVar167._12_4_ = auVar117._12_4_ * auVar96._12_4_;
            auVar167._16_4_ = fVar140 * auVar96._16_4_;
            auVar167._20_4_ = fVar177 * auVar96._20_4_;
            auVar167._24_4_ = fVar176 * auVar96._24_4_;
            auVar167._28_4_ = 0;
            auVar80 = vfmsub231ps_fma(auVar167,auVar84,auVar116);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar93,auVar99);
            auVar88 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar79));
            auVar99 = vmaxps_avx(auVar87,auVar88);
            uVar141 = vcmpps_avx512vl(auVar99,auVar93,2);
            bVar72 = bVar72 & (byte)uVar141;
            if (bVar72 != 0) {
              uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar193._4_4_ = uVar130;
              auVar193._0_4_ = uVar130;
              auVar193._8_4_ = uVar130;
              auVar193._12_4_ = uVar130;
              auVar193._16_4_ = uVar130;
              auVar193._20_4_ = uVar130;
              auVar193._24_4_ = uVar130;
              auVar193._28_4_ = uVar130;
              auVar197 = ZEXT3264(auVar193);
              auVar55._4_4_ = auVar85._4_4_ * auVar101._4_4_;
              auVar55._0_4_ = auVar85._0_4_ * auVar101._0_4_;
              auVar55._8_4_ = auVar85._8_4_ * auVar101._8_4_;
              auVar55._12_4_ = auVar85._12_4_ * auVar101._12_4_;
              auVar55._16_4_ = auVar85._16_4_ * auVar101._16_4_;
              auVar55._20_4_ = auVar85._20_4_ * auVar101._20_4_;
              auVar55._24_4_ = auVar85._24_4_ * auVar101._24_4_;
              auVar55._28_4_ = auVar99._28_4_;
              auVar202 = vfmsub231ps_fma(auVar55,auVar84,auVar97);
              auVar56._4_4_ = auVar97._4_4_ * auVar96._4_4_;
              auVar56._0_4_ = auVar97._0_4_ * auVar96._0_4_;
              auVar56._8_4_ = auVar97._8_4_ * auVar96._8_4_;
              auVar56._12_4_ = auVar97._12_4_ * auVar96._12_4_;
              auVar56._16_4_ = auVar97._16_4_ * auVar96._16_4_;
              auVar56._20_4_ = auVar97._20_4_ * auVar96._20_4_;
              auVar56._24_4_ = auVar97._24_4_ * auVar96._24_4_;
              auVar56._28_4_ = auVar97._28_4_;
              auVar80 = vfmsub231ps_fma(auVar56,auVar95,auVar85);
              auVar57._4_4_ = auVar84._4_4_ * auVar95._4_4_;
              auVar57._0_4_ = auVar84._0_4_ * auVar95._0_4_;
              auVar57._8_4_ = auVar84._8_4_ * auVar95._8_4_;
              auVar57._12_4_ = auVar84._12_4_ * auVar95._12_4_;
              auVar57._16_4_ = auVar84._16_4_ * auVar95._16_4_;
              auVar57._20_4_ = auVar84._20_4_ * auVar95._20_4_;
              auVar57._24_4_ = auVar84._24_4_ * auVar95._24_4_;
              auVar57._28_4_ = auVar84._28_4_;
              auVar20 = vfmsub231ps_fma(auVar57,auVar96,auVar101);
              auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar80),ZEXT1632(auVar20));
              auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar202),auVar93);
              auVar101 = vrcp14ps_avx512vl(auVar99);
              auVar96 = auVar201._0_32_;
              auVar97 = vfnmadd213ps_avx512vl(auVar101,auVar99,auVar96);
              auVar79 = vfmadd132ps_fma(auVar97,auVar101,auVar101);
              auVar58._4_4_ = auVar20._4_4_ * auVar115._4_4_;
              auVar58._0_4_ = auVar20._0_4_ * auVar115._0_4_;
              auVar58._8_4_ = auVar20._8_4_ * auVar115._8_4_;
              auVar58._12_4_ = auVar20._12_4_ * auVar115._12_4_;
              auVar58._16_4_ = fVar139 * 0.0;
              auVar58._20_4_ = fVar129 * 0.0;
              auVar58._24_4_ = fVar154 * 0.0;
              auVar58._28_4_ = iVar1;
              auVar80 = vfmadd231ps_fma(auVar58,auVar89,ZEXT1632(auVar80));
              auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar86,ZEXT1632(auVar202));
              fVar129 = auVar79._0_4_;
              fVar154 = auVar79._4_4_;
              fVar139 = auVar79._8_4_;
              fVar140 = auVar79._12_4_;
              local_380 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar140,
                                             CONCAT48(auVar80._8_4_ * fVar139,
                                                      CONCAT44(auVar80._4_4_ * fVar154,
                                                               auVar80._0_4_ * fVar129))));
              uVar141 = vcmpps_avx512vl(local_380,auVar193,2);
              auVar60._4_4_ = uStack_49c;
              auVar60._0_4_ = local_4a0;
              auVar60._8_4_ = uStack_498;
              auVar60._12_4_ = uStack_494;
              auVar60._16_4_ = uStack_490;
              auVar60._20_4_ = uStack_48c;
              auVar60._24_4_ = uStack_488;
              auVar60._28_4_ = uStack_484;
              uVar25 = vcmpps_avx512vl(local_380,auVar60,0xd);
              bVar72 = (byte)uVar141 & (byte)uVar25 & bVar72;
              if (bVar72 != 0) {
                uVar141 = vcmpps_avx512vl(auVar99,auVar93,4);
                bVar72 = bVar72 & (byte)uVar141;
                auVar200 = ZEXT3264(local_680);
                auVar199 = ZEXT3264(local_6a0);
                if (bVar72 != 0) {
                  fVar177 = auVar87._0_4_ * fVar129;
                  fVar176 = auVar87._4_4_ * fVar154;
                  auVar59._4_4_ = fVar176;
                  auVar59._0_4_ = fVar177;
                  fVar180 = auVar87._8_4_ * fVar139;
                  auVar59._8_4_ = fVar180;
                  fVar73 = auVar87._12_4_ * fVar140;
                  auVar59._12_4_ = fVar73;
                  fVar74 = auVar87._16_4_ * 0.0;
                  auVar59._16_4_ = fVar74;
                  fVar121 = auVar87._20_4_ * 0.0;
                  auVar59._20_4_ = fVar121;
                  fVar122 = auVar87._24_4_ * 0.0;
                  auVar59._24_4_ = fVar122;
                  auVar59._28_4_ = auVar99._28_4_;
                  auVar101 = vsubps_avx512vl(auVar96,auVar59);
                  local_3c0._0_4_ =
                       (float)((uint)(bVar62 & 1) * (int)fVar177 |
                              (uint)!(bool)(bVar62 & 1) * auVar101._0_4_);
                  bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
                  local_3c0._4_4_ =
                       (float)((uint)bVar12 * (int)fVar176 | (uint)!bVar12 * auVar101._4_4_);
                  bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
                  local_3c0._8_4_ =
                       (float)((uint)bVar12 * (int)fVar180 | (uint)!bVar12 * auVar101._8_4_);
                  bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
                  local_3c0._12_4_ =
                       (float)((uint)bVar12 * (int)fVar73 | (uint)!bVar12 * auVar101._12_4_);
                  bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
                  local_3c0._16_4_ =
                       (float)((uint)bVar12 * (int)fVar74 | (uint)!bVar12 * auVar101._16_4_);
                  bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
                  local_3c0._20_4_ =
                       (float)((uint)bVar12 * (int)fVar121 | (uint)!bVar12 * auVar101._20_4_);
                  bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
                  local_3c0._24_4_ =
                       (float)((uint)bVar12 * (int)fVar122 | (uint)!bVar12 * auVar101._24_4_);
                  bVar12 = SUB81(uVar63 >> 7,0);
                  local_3c0._28_4_ =
                       (float)((uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar101._28_4_);
                  auVar99 = vsubps_avx(ZEXT1632(auVar78),auVar90);
                  auVar79 = vfmadd213ps_fma(auVar99,local_3c0,auVar90);
                  uVar130 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                  auVar35._4_4_ = uVar130;
                  auVar35._0_4_ = uVar130;
                  auVar35._8_4_ = uVar130;
                  auVar35._12_4_ = uVar130;
                  auVar35._16_4_ = uVar130;
                  auVar35._20_4_ = uVar130;
                  auVar35._24_4_ = uVar130;
                  auVar35._28_4_ = uVar130;
                  auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                               CONCAT48(auVar79._8_4_ +
                                                                        auVar79._8_4_,
                                                                        CONCAT44(auVar79._4_4_ +
                                                                                 auVar79._4_4_,
                                                                                 auVar79._0_4_ +
                                                                                 auVar79._0_4_)))),
                                            auVar35);
                  uVar141 = vcmpps_avx512vl(local_380,auVar99,6);
                  if (((byte)uVar141 & bVar72) != 0) {
                    auVar148._0_4_ = auVar88._0_4_ * fVar129;
                    auVar148._4_4_ = auVar88._4_4_ * fVar154;
                    auVar148._8_4_ = auVar88._8_4_ * fVar139;
                    auVar148._12_4_ = auVar88._12_4_ * fVar140;
                    auVar148._16_4_ = auVar88._16_4_ * 0.0;
                    auVar148._20_4_ = auVar88._20_4_ * 0.0;
                    auVar148._24_4_ = auVar88._24_4_ * 0.0;
                    auVar148._28_4_ = 0;
                    auVar99 = vsubps_avx512vl(auVar96,auVar148);
                    auVar120._0_4_ =
                         (uint)(bVar62 & 1) * (int)auVar148._0_4_ |
                         (uint)!(bool)(bVar62 & 1) * auVar99._0_4_;
                    bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
                    auVar120._4_4_ =
                         (uint)bVar12 * (int)auVar148._4_4_ | (uint)!bVar12 * auVar99._4_4_;
                    bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
                    auVar120._8_4_ =
                         (uint)bVar12 * (int)auVar148._8_4_ | (uint)!bVar12 * auVar99._8_4_;
                    bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
                    auVar120._12_4_ =
                         (uint)bVar12 * (int)auVar148._12_4_ | (uint)!bVar12 * auVar99._12_4_;
                    bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
                    auVar120._16_4_ =
                         (uint)bVar12 * (int)auVar148._16_4_ | (uint)!bVar12 * auVar99._16_4_;
                    bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
                    auVar120._20_4_ =
                         (uint)bVar12 * (int)auVar148._20_4_ | (uint)!bVar12 * auVar99._20_4_;
                    bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
                    auVar120._24_4_ =
                         (uint)bVar12 * (int)auVar148._24_4_ | (uint)!bVar12 * auVar99._24_4_;
                    auVar120._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar99._28_4_;
                    auVar36._8_4_ = 0x40000000;
                    auVar36._0_8_ = 0x4000000040000000;
                    auVar36._12_4_ = 0x40000000;
                    auVar36._16_4_ = 0x40000000;
                    auVar36._20_4_ = 0x40000000;
                    auVar36._24_4_ = 0x40000000;
                    auVar36._28_4_ = 0x40000000;
                    local_3a0 = vfmsub132ps_avx512vl(auVar120,auVar96,auVar36);
                    local_360 = (undefined4)lVar70;
                    local_350 = local_630._0_8_;
                    uStack_348 = local_630._8_8_;
                    local_340 = local_640._0_8_;
                    uStack_338 = local_640._8_8_;
                    local_330 = local_650._0_8_;
                    uStack_328 = local_650._8_8_;
                    pGVar9 = (context->scene->geometries).items[uVar7].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar62 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar62 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar79 = vcvtsi2ss_avx512f(auVar201._0_16_,local_360);
                      fVar129 = auVar79._0_4_;
                      local_300[0] = (fVar129 + local_3c0._0_4_ + 0.0) * (float)local_400._0_4_;
                      local_300[1] = (fVar129 + local_3c0._4_4_ + 1.0) * (float)local_400._4_4_;
                      local_300[2] = (fVar129 + local_3c0._8_4_ + 2.0) * fStack_3f8;
                      local_300[3] = (fVar129 + local_3c0._12_4_ + 3.0) * fStack_3f4;
                      fStack_2f0 = (fVar129 + local_3c0._16_4_ + 4.0) * fStack_3f0;
                      fStack_2ec = (fVar129 + local_3c0._20_4_ + 5.0) * fStack_3ec;
                      fStack_2e8 = (fVar129 + local_3c0._24_4_ + 6.0) * fStack_3e8;
                      fStack_2e4 = fVar129 + local_3c0._28_4_ + 7.0;
                      local_2e0 = local_3a0;
                      local_2c0 = local_380;
                      lVar64 = 0;
                      uVar68 = (ulong)((byte)uVar141 & bVar72);
                      for (uVar63 = uVar68; (uVar63 & 1) == 0;
                          uVar63 = uVar63 >> 1 | 0x8000000000000000) {
                        lVar64 = lVar64 + 1;
                      }
                      local_4e0._0_4_ = (int)uVar66;
                      local_2a0 = auVar193;
                      local_35c = iVar8;
                      do {
                        auVar202 = auVar203._0_16_;
                        fVar129 = local_300[lVar64];
                        auVar147._4_4_ = fVar129;
                        auVar147._0_4_ = fVar129;
                        auVar147._8_4_ = fVar129;
                        auVar147._12_4_ = fVar129;
                        local_200._16_4_ = fVar129;
                        local_200._0_16_ = auVar147;
                        local_200._20_4_ = fVar129;
                        local_200._24_4_ = fVar129;
                        local_200._28_4_ = fVar129;
                        local_420._0_8_ = lVar64;
                        local_1e0 = *(undefined4 *)(local_2e0 + lVar64 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2c0 + lVar64 * 4);
                        local_6d0.context = context->user;
                        fVar154 = 1.0 - fVar129;
                        auVar33._8_4_ = 0x80000000;
                        auVar33._0_8_ = 0x8000000080000000;
                        auVar33._12_4_ = 0x80000000;
                        auVar80 = vxorps_avx512vl(ZEXT416((uint)fVar154),auVar33);
                        auVar79 = ZEXT416((uint)(fVar129 * fVar154 * 4.0));
                        auVar78 = vfnmsub213ss_fma(auVar147,auVar147,auVar79);
                        auVar79 = vfmadd213ss_fma(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154),
                                                  auVar79);
                        fVar154 = fVar154 * auVar80._0_4_ * 0.5;
                        fVar139 = auVar78._0_4_ * 0.5;
                        fVar140 = auVar79._0_4_ * 0.5;
                        fVar129 = fVar129 * fVar129 * 0.5;
                        auVar173._0_4_ = fVar129 * (float)local_4b0._0_4_;
                        auVar173._4_4_ = fVar129 * (float)local_4b0._4_4_;
                        auVar173._8_4_ = fVar129 * fStack_4a8;
                        auVar173._12_4_ = fVar129 * fStack_4a4;
                        auVar137._4_4_ = fVar140;
                        auVar137._0_4_ = fVar140;
                        auVar137._8_4_ = fVar140;
                        auVar137._12_4_ = fVar140;
                        auVar79 = vfmadd132ps_fma(auVar137,auVar173,local_650);
                        auVar162._4_4_ = fVar139;
                        auVar162._0_4_ = fVar139;
                        auVar162._8_4_ = fVar139;
                        auVar162._12_4_ = fVar139;
                        auVar79 = vfmadd132ps_fma(auVar162,auVar79,local_640);
                        auVar138._4_4_ = fVar154;
                        auVar138._0_4_ = fVar154;
                        auVar138._8_4_ = fVar154;
                        auVar138._12_4_ = fVar154;
                        auVar79 = vfmadd132ps_fma(auVar138,auVar79,local_630);
                        local_260 = auVar79._0_4_;
                        auVar168._8_4_ = 1;
                        auVar168._0_8_ = 0x100000001;
                        auVar168._12_4_ = 1;
                        auVar168._16_4_ = 1;
                        auVar168._20_4_ = 1;
                        auVar168._24_4_ = 1;
                        auVar168._28_4_ = 1;
                        local_240 = vpermps_avx2(auVar168,ZEXT1632(auVar79));
                        auVar175._8_4_ = 2;
                        auVar175._0_8_ = 0x200000002;
                        auVar175._12_4_ = 2;
                        auVar175._16_4_ = 2;
                        auVar175._20_4_ = 2;
                        auVar175._24_4_ = 2;
                        auVar175._28_4_ = 2;
                        local_220 = vpermps_avx2(auVar175,ZEXT1632(auVar79));
                        uStack_25c = local_260;
                        uStack_258 = local_260;
                        uStack_254 = local_260;
                        uStack_250 = local_260;
                        uStack_24c = local_260;
                        uStack_248 = local_260;
                        uStack_244 = local_260;
                        uStack_1dc = local_1e0;
                        uStack_1d8 = local_1e0;
                        uStack_1d4 = local_1e0;
                        uStack_1d0 = local_1e0;
                        uStack_1cc = local_1e0;
                        uStack_1c8 = local_1e0;
                        uStack_1c4 = local_1e0;
                        local_1c0 = local_440._0_8_;
                        uStack_1b8 = local_440._8_8_;
                        uStack_1b0 = local_440._16_8_;
                        uStack_1a8 = local_440._24_8_;
                        local_1a0 = local_460;
                        vpcmpeqd_avx2(local_460,local_460);
                        local_180 = (local_6d0.context)->instID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_160 = (local_6d0.context)->instPrimID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_5a0 = local_280;
                        local_6d0.valid = (int *)local_5a0;
                        local_6d0.geometryUserPtr = pGVar9->userPtr;
                        local_6d0.hit = (RTCHitN *)&local_260;
                        local_6d0.N = 8;
                        local_6d0.ray = (RTCRayN *)ray;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_6d0);
                          auVar197 = ZEXT3264(local_2a0);
                          uVar66 = (ulong)(uint)local_4e0._0_4_;
                          auVar199 = ZEXT3264(local_6a0);
                          auVar200 = ZEXT3264(local_680);
                          auVar205 = ZEXT3264(local_520);
                          auVar204 = ZEXT3264(local_500);
                          auVar79 = vxorps_avx512vl(auVar202,auVar202);
                          auVar203 = ZEXT1664(auVar79);
                        }
                        auVar79 = auVar203._0_16_;
                        if (local_5a0 == (undefined1  [32])0x0) {
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar201 = ZEXT3264(auVar99);
                          auVar209 = ZEXT3264(local_5c0);
                          auVar206 = ZEXT3264(local_5e0);
                          auVar207 = ZEXT3264(local_600);
                          auVar208 = ZEXT3264(local_620);
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var11)(&local_6d0);
                            auVar197 = ZEXT3264(local_2a0);
                            uVar66 = (ulong)(uint)local_4e0._0_4_;
                            auVar199 = ZEXT3264(local_6a0);
                            auVar200 = ZEXT3264(local_680);
                            auVar205 = ZEXT3264(local_520);
                            auVar204 = ZEXT3264(local_500);
                            auVar79 = vxorps_avx512vl(auVar79,auVar79);
                            auVar203 = ZEXT1664(auVar79);
                          }
                          uVar63 = vptestmd_avx512vl(local_5a0,local_5a0);
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar12 = (bool)((byte)uVar63 & 1);
                          bVar13 = (bool)((byte)(uVar63 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar63 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar63 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar63 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar63 >> 6) & 1);
                          bVar19 = SUB81(uVar63 >> 7,0);
                          *(uint *)(local_6d0.ray + 0x100) =
                               (uint)bVar12 * auVar99._0_4_ |
                               (uint)!bVar12 * *(int *)(local_6d0.ray + 0x100);
                          *(uint *)(local_6d0.ray + 0x104) =
                               (uint)bVar13 * auVar99._4_4_ |
                               (uint)!bVar13 * *(int *)(local_6d0.ray + 0x104);
                          *(uint *)(local_6d0.ray + 0x108) =
                               (uint)bVar14 * auVar99._8_4_ |
                               (uint)!bVar14 * *(int *)(local_6d0.ray + 0x108);
                          *(uint *)(local_6d0.ray + 0x10c) =
                               (uint)bVar15 * auVar99._12_4_ |
                               (uint)!bVar15 * *(int *)(local_6d0.ray + 0x10c);
                          *(uint *)(local_6d0.ray + 0x110) =
                               (uint)bVar16 * auVar99._16_4_ |
                               (uint)!bVar16 * *(int *)(local_6d0.ray + 0x110);
                          *(uint *)(local_6d0.ray + 0x114) =
                               (uint)bVar17 * auVar99._20_4_ |
                               (uint)!bVar17 * *(int *)(local_6d0.ray + 0x114);
                          *(uint *)(local_6d0.ray + 0x118) =
                               (uint)bVar18 * auVar99._24_4_ |
                               (uint)!bVar18 * *(int *)(local_6d0.ray + 0x118);
                          *(uint *)(local_6d0.ray + 0x11c) =
                               (uint)bVar19 * auVar99._28_4_ |
                               (uint)!bVar19 * *(int *)(local_6d0.ray + 0x11c);
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar201 = ZEXT3264(auVar99);
                          auVar209 = ZEXT3264(local_5c0);
                          auVar206 = ZEXT3264(local_5e0);
                          auVar207 = ZEXT3264(local_600);
                          auVar208 = ZEXT3264(local_620);
                          if (local_5a0 != (undefined1  [32])0x0) {
                            bVar62 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x100) = auVar197._0_4_;
                        bVar62 = 0;
                        lVar64 = 0;
                        uVar68 = uVar68 ^ 1L << (local_420._0_8_ & 0x3f);
                        for (uVar63 = uVar68; (uVar63 & 1) == 0;
                            uVar63 = uVar63 >> 1 | 0x8000000000000000) {
                          lVar64 = lVar64 + 1;
                        }
                      } while (uVar68 != 0);
                    }
                    uVar66 = CONCAT71((int7)(uVar66 >> 8),(byte)uVar66 | bVar62);
                  }
                }
                goto LAB_01bbb5a3;
              }
            }
            auVar200 = ZEXT3264(local_680);
            auVar199 = ZEXT3264(local_6a0);
          }
LAB_01bbb5a3:
          lVar70 = lVar70 + 8;
        } while ((int)lVar70 < iVar8);
      }
      bVar72 = (byte)uVar66;
      if ((uVar66 & 1) != 0) break;
      uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar32._4_4_ = uVar130;
      auVar32._0_4_ = uVar130;
      auVar32._8_4_ = uVar130;
      auVar32._12_4_ = uVar130;
      uVar141 = vcmpps_avx512vl(local_3d0,auVar32,2);
      uVar69 = (uint)uVar71 & (uint)uVar71 + 0xf & (uint)uVar141;
      uVar71 = (ulong)uVar69;
    } while (uVar69 != 0);
  }
  return (bool)(bVar72 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }